

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O2

void embree::avx2::
     BVHNIntersectorKHybrid<4,_8,_16777232,_true,_embree::avx2::ArrayIntersectorK_1<8,_embree::avx2::QuadMiMBIntersectorKPluecker<4,_8,_true>_>,_true>
     ::occluded(vint<8> *valid_i,Intersectors *This,RayK<8> *ray,RayQueryContext *context)

{
  RayK<8> *pRVar1;
  float *pfVar2;
  RTCRayQueryFlags RVar3;
  RTCFeatureFlags RVar4;
  BBox1f BVar5;
  RTCIntersectArguments RVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  float fVar10;
  Geometry *pGVar11;
  RTCRayQueryContext *pRVar12;
  RTCFilterFunctionN p_Var13;
  vfloat_impl<8> vVar14;
  vfloat_impl<8> vVar15;
  undefined1 auVar16 [32];
  size_t k;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  float fVar72;
  float fVar73;
  float fVar74;
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [28];
  float fVar81;
  float fVar82;
  float fVar83;
  float fVar84;
  float fVar85;
  undefined8 uVar86;
  undefined4 uVar87;
  undefined4 uVar88;
  undefined4 uVar89;
  undefined4 uVar90;
  undefined4 uVar91;
  undefined4 uVar92;
  undefined4 uVar93;
  undefined4 uVar94;
  undefined4 uVar95;
  undefined4 uVar96;
  undefined4 uVar97;
  undefined4 uVar98;
  undefined4 uVar99;
  undefined4 uVar100;
  undefined4 uVar101;
  undefined4 uVar102;
  undefined4 uVar103;
  undefined4 uVar104;
  undefined4 uVar105;
  undefined4 uVar106;
  undefined4 uVar107;
  undefined4 uVar108;
  undefined4 uVar109;
  undefined4 uVar110;
  undefined4 uVar111;
  undefined4 uVar112;
  undefined4 uVar113;
  undefined4 uVar114;
  undefined4 uVar115;
  undefined4 uVar116;
  undefined4 uVar117;
  undefined4 uVar118;
  undefined4 uVar119;
  undefined4 uVar120;
  undefined4 uVar121;
  undefined4 uVar122;
  undefined4 uVar123;
  bool bVar124;
  int iVar125;
  uint uVar126;
  AABBNodeMB4D *node1;
  ulong uVar127;
  RTCIntersectArguments *pRVar128;
  long lVar129;
  long lVar130;
  undefined1 (*pauVar131) [32];
  ulong uVar132;
  ulong uVar133;
  long lVar134;
  undefined4 uVar135;
  RTCIntersectArguments *unaff_R12;
  vuint<4> *v;
  uint uVar136;
  NodeRef root;
  ulong *puVar137;
  float fVar138;
  float fVar139;
  float fVar153;
  float fVar155;
  undefined1 auVar140 [16];
  float fVar159;
  float fVar160;
  float fVar161;
  undefined1 auVar141 [32];
  float fVar157;
  undefined1 auVar142 [32];
  undefined1 auVar143 [32];
  undefined1 auVar144 [32];
  undefined1 auVar145 [32];
  float fVar154;
  float fVar156;
  float fVar158;
  undefined1 auVar147 [32];
  undefined1 auVar148 [32];
  undefined1 auVar149 [32];
  undefined1 auVar150 [32];
  undefined1 auVar151 [32];
  undefined1 auVar152 [32];
  undefined8 extraout_XMM1_Qa;
  undefined1 auVar162 [32];
  undefined1 auVar163 [32];
  undefined1 auVar164 [32];
  undefined1 auVar165 [32];
  undefined1 auVar166 [32];
  undefined1 auVar167 [32];
  undefined1 auVar168 [32];
  undefined1 auVar169 [32];
  undefined1 auVar170 [32];
  undefined1 auVar171 [32];
  undefined1 in_ZMM1 [64];
  undefined1 auVar172 [64];
  undefined1 extraout_var [56];
  float fVar174;
  float fVar187;
  float fVar188;
  undefined1 auVar175 [16];
  float fVar190;
  float fVar191;
  float fVar192;
  undefined1 auVar176 [32];
  undefined1 auVar177 [32];
  undefined1 auVar178 [32];
  undefined1 auVar179 [32];
  undefined1 auVar180 [32];
  undefined1 auVar181 [32];
  float fVar189;
  undefined1 auVar182 [32];
  undefined1 auVar183 [32];
  undefined1 auVar184 [32];
  undefined1 auVar185 [32];
  undefined1 auVar186 [64];
  float fVar193;
  float fVar203;
  float fVar204;
  float fVar205;
  float fVar206;
  float fVar207;
  float fVar208;
  undefined1 auVar194 [32];
  undefined1 auVar195 [32];
  undefined1 auVar196 [32];
  undefined1 auVar197 [32];
  undefined1 auVar198 [32];
  undefined1 auVar199 [32];
  undefined1 auVar200 [32];
  undefined1 auVar201 [32];
  undefined1 auVar202 [32];
  float fVar221;
  undefined1 auVar209 [32];
  undefined1 auVar210 [32];
  undefined1 auVar211 [32];
  undefined1 auVar212 [32];
  undefined1 auVar213 [32];
  undefined1 auVar214 [32];
  undefined1 auVar215 [32];
  undefined1 auVar216 [32];
  undefined1 auVar217 [32];
  undefined1 auVar218 [32];
  undefined1 auVar219 [32];
  undefined1 auVar220 [32];
  undefined1 auVar222 [32];
  undefined1 auVar223 [32];
  undefined1 auVar224 [32];
  undefined1 auVar225 [32];
  undefined1 auVar226 [32];
  undefined1 auVar227 [32];
  undefined1 auVar228 [32];
  undefined1 auVar229 [32];
  undefined1 auVar230 [32];
  undefined1 auVar231 [32];
  undefined1 auVar232 [32];
  undefined1 auVar233 [32];
  undefined1 auVar234 [32];
  undefined1 auVar235 [32];
  undefined1 auVar236 [32];
  undefined1 auVar237 [32];
  undefined1 auVar238 [32];
  undefined1 auVar239 [32];
  undefined1 auVar240 [32];
  undefined1 auVar241 [32];
  float fVar243;
  float fVar244;
  float fVar245;
  float fVar246;
  float fVar247;
  float fVar248;
  float fVar249;
  float fVar250;
  float fVar251;
  float fVar252;
  undefined1 auVar242 [64];
  undefined1 auVar253 [32];
  undefined1 auVar254 [32];
  undefined1 auVar255 [32];
  undefined1 auVar256 [32];
  undefined1 auVar257 [32];
  undefined1 auVar258 [32];
  undefined1 auVar259 [32];
  undefined1 auVar260 [32];
  undefined1 auVar261 [32];
  undefined1 auVar262 [32];
  float fVar263;
  undefined1 auVar264 [32];
  float fVar266;
  float fVar267;
  float fVar268;
  float fVar269;
  float fVar270;
  float fVar271;
  undefined1 auVar265 [64];
  undefined1 auVar272 [16];
  undefined1 auVar274 [64];
  undefined1 auVar275 [64];
  undefined1 auVar276 [32];
  undefined1 in_ZMM12 [64];
  undefined1 in_ZMM13 [64];
  undefined1 auVar277 [64];
  float fVar278;
  float fVar280;
  float fVar281;
  float fVar282;
  float fVar283;
  float fVar284;
  float fVar285;
  undefined1 in_ZMM14 [64];
  undefined1 auVar279 [64];
  float fVar286;
  float fVar288;
  float fVar289;
  float fVar290;
  float fVar291;
  float fVar292;
  float fVar293;
  undefined1 in_ZMM15 [64];
  undefined1 auVar287 [64];
  Precalculations pre;
  vint<8> itime;
  Vec3<embree::vfloat_impl<8>_> p1;
  QuadMesh *mesh;
  vbool<8> terminated;
  Vec3<embree::vfloat_impl<8>_> p0;
  vfloat<8> t;
  vfloat<8> v_2;
  vfloat<8> u;
  TravRayK<8,_true> tray;
  NodeRef stack_node [241];
  vfloat<8> stack_near [241];
  Precalculations local_2e81;
  RTCFilterFunctionNArguments local_2e80;
  RTCIntersectArguments *local_2e50;
  ulong local_2e48;
  undefined1 local_2e40 [8];
  undefined1 auStack_2e38 [8];
  float fStack_2e30;
  float fStack_2e2c;
  float fStack_2e28;
  float fStack_2e24;
  undefined1 local_2e20 [32];
  RTCIntersectArguments *local_2df0;
  int local_2de4;
  undefined1 local_2de0 [32];
  undefined1 local_2dc0 [32];
  undefined1 local_2da0 [8];
  float fStack_2d98;
  float fStack_2d94;
  float fStack_2d90;
  float fStack_2d8c;
  float fStack_2d88;
  float fStack_2d84;
  undefined1 local_2d80 [32];
  undefined1 (*local_2d48) [32];
  float local_2d40 [4];
  float fStack_2d30;
  float fStack_2d2c;
  float fStack_2d28;
  float fStack_2d24;
  float local_2d20 [4];
  float fStack_2d10;
  float fStack_2d0c;
  float fStack_2d08;
  undefined4 uStack_2d04;
  float local_2d00 [4];
  float fStack_2cf0;
  float fStack_2cec;
  float fStack_2ce8;
  undefined4 uStack_2ce4;
  undefined1 local_2ce0 [32];
  undefined1 local_2cc0 [8];
  float fStack_2cb8;
  float fStack_2cb4;
  float fStack_2cb0;
  float fStack_2cac;
  float fStack_2ca8;
  float fStack_2ca4;
  undefined1 local_2ca0 [32];
  undefined1 local_2c80 [32];
  BVH *local_2c48;
  Intersectors *local_2c40;
  RTCIntersectArguments *local_2c38;
  ulong local_2c30;
  ulong local_2c28;
  undefined1 local_2c20 [32];
  anon_union_96_2_4062524c_for_Vec3<embree::vfloat_impl<8>_>_1 local_2c00;
  undefined1 local_2ba0 [32];
  undefined1 local_2b80 [32];
  undefined1 local_2b60 [32];
  uint local_2b40;
  uint uStack_2b3c;
  uint uStack_2b38;
  uint uStack_2b34;
  uint uStack_2b30;
  uint uStack_2b2c;
  uint uStack_2b28;
  uint uStack_2b24;
  uint local_2b20;
  uint uStack_2b1c;
  uint uStack_2b18;
  uint uStack_2b14;
  uint uStack_2b10;
  uint uStack_2b0c;
  uint uStack_2b08;
  uint uStack_2b04;
  uint local_2b00;
  uint uStack_2afc;
  uint uStack_2af8;
  uint uStack_2af4;
  uint uStack_2af0;
  uint uStack_2aec;
  uint uStack_2ae8;
  uint uStack_2ae4;
  undefined1 local_2ae0 [32];
  undefined1 local_2ac0 [32];
  undefined1 local_2aa0 [32];
  undefined1 local_2a80 [8];
  float fStack_2a78;
  float fStack_2a74;
  float fStack_2a70;
  float fStack_2a6c;
  float fStack_2a68;
  undefined1 local_2a60 [32];
  undefined1 local_2a40 [32];
  undefined1 local_2a20 [32];
  undefined1 local_2a00 [32];
  undefined1 local_29e0 [32];
  undefined1 local_29c0 [32];
  undefined1 local_29a0 [8];
  float fStack_2998;
  float fStack_2994;
  float fStack_2990;
  float fStack_298c;
  float fStack_2988;
  float fStack_2984;
  undefined1 local_2980 [8];
  float fStack_2978;
  float fStack_2974;
  float fStack_2970;
  float fStack_296c;
  float fStack_2968;
  float fStack_2964;
  undefined1 local_2960 [8];
  float fStack_2958;
  float fStack_2954;
  float fStack_2950;
  float fStack_294c;
  float fStack_2948;
  float fStack_2944;
  undefined1 local_2940 [32];
  anon_union_96_2_4062524c_for_Vec3<embree::vfloat_impl<8>_>_1 local_2920;
  undefined1 local_28c0 [32];
  undefined1 local_28a0 [32];
  undefined1 local_2880 [32];
  undefined1 local_2860 [32];
  undefined1 local_2840 [32];
  undefined1 local_2820 [8];
  float fStack_2818;
  float fStack_2814;
  float fStack_2810;
  float fStack_280c;
  float fStack_2808;
  undefined1 local_2800 [32];
  undefined1 local_27e0 [32];
  undefined1 local_27c0 [32];
  undefined1 local_27a0 [32];
  undefined1 local_2780 [32];
  undefined1 local_2760 [32];
  undefined8 local_2740;
  undefined8 uStack_2738;
  undefined8 uStack_2730;
  undefined8 uStack_2728;
  undefined8 local_2720;
  undefined8 uStack_2718;
  undefined8 uStack_2710;
  undefined8 uStack_2708;
  undefined1 local_2700 [32];
  undefined1 local_26e0 [32];
  undefined1 local_26c0 [32];
  undefined1 local_26a0 [32];
  undefined1 local_2680 [32];
  undefined1 local_2660 [32];
  undefined1 local_2640 [32];
  undefined8 local_2610;
  size_t local_2608;
  ulong local_2600 [240];
  undefined4 local_1e80;
  undefined4 uStack_1e7c;
  undefined4 uStack_1e78;
  undefined4 uStack_1e74;
  undefined4 uStack_1e70;
  undefined4 uStack_1e6c;
  undefined4 uStack_1e68;
  undefined4 uStack_1e64;
  undefined1 local_1e60 [32];
  undefined1 local_1e40 [7696];
  undefined1 auVar146 [32];
  undefined1 auVar173 [64];
  undefined1 auVar273 [32];
  
  local_2608 = (((BVH *)This->ptr)->root).ptr;
  if (local_2608 != 8) {
    auVar147 = vpcmpeqd_avx2(in_ZMM1._0_32_,in_ZMM1._0_32_);
    auVar175 = ZEXT816(0) << 0x40;
    auVar162 = vpcmpeqd_avx2(auVar147,(undefined1  [32])valid_i->field_0);
    auVar147 = vcmpps_avx(*(undefined1 (*) [32])(ray + 0x100),ZEXT1632(auVar175),5);
    auVar176 = auVar162 & auVar147;
    if ((((((((auVar176 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (auVar176 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (auVar176 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(auVar176 >> 0x7f,0) != '\0') ||
          (auVar176 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(auVar176 >> 0xbf,0) != '\0') ||
        (auVar176 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
        auVar176[0x1f] < '\0') {
      auVar147 = vandps_avx(auVar147,auVar162);
      auVar140 = vpackssdw_avx(auVar147._0_16_,auVar147._16_16_);
      local_2920._0_8_ = *(undefined8 *)ray;
      local_2920._8_8_ = *(undefined8 *)(ray + 8);
      local_2920._16_8_ = *(undefined8 *)(ray + 0x10);
      local_2920._24_8_ = *(undefined8 *)(ray + 0x18);
      local_2920._32_8_ = *(undefined8 *)(ray + 0x20);
      local_2920._40_8_ = *(undefined8 *)(ray + 0x28);
      local_2920._48_8_ = *(undefined8 *)(ray + 0x30);
      local_2920._56_8_ = *(undefined8 *)(ray + 0x38);
      local_2920._64_8_ = *(undefined8 *)(ray + 0x40);
      local_2920._72_8_ = *(undefined8 *)(ray + 0x48);
      local_2920._80_8_ = *(undefined8 *)(ray + 0x50);
      local_2920._88_8_ = *(undefined8 *)(ray + 0x58);
      local_28c0 = *(undefined1 (*) [32])(ray + 0x80);
      local_28a0 = *(undefined1 (*) [32])(ray + 0xa0);
      local_2880 = *(undefined1 (*) [32])(ray + 0xc0);
      local_2940._8_4_ = 0x7fffffff;
      local_2940._0_8_ = 0x7fffffff7fffffff;
      local_2940._12_4_ = 0x7fffffff;
      local_2940._16_4_ = 0x7fffffff;
      local_2940._20_4_ = 0x7fffffff;
      local_2940._24_4_ = 0x7fffffff;
      local_2940._28_4_ = 0x7fffffff;
      auVar265 = ZEXT3264(local_2940);
      auVar259._8_4_ = 0x219392ef;
      auVar259._0_8_ = 0x219392ef219392ef;
      auVar259._12_4_ = 0x219392ef;
      auVar259._16_4_ = 0x219392ef;
      auVar259._20_4_ = 0x219392ef;
      auVar259._24_4_ = 0x219392ef;
      auVar259._28_4_ = 0x219392ef;
      auVar273._8_4_ = 0x3f800000;
      auVar273._0_8_ = 0x3f8000003f800000;
      auVar273._12_4_ = 0x3f800000;
      auVar273._16_4_ = 0x3f800000;
      auVar273._20_4_ = 0x3f800000;
      auVar273._24_4_ = 0x3f800000;
      auVar273._28_4_ = 0x3f800000;
      auVar274 = ZEXT3264(auVar273);
      auVar194 = vdivps_avx(auVar273,local_28c0);
      auVar147 = vandps_avx(local_2940,local_28c0);
      auVar176 = vcmpps_avx(auVar147,auVar259,1);
      auVar147 = vandps_avx(local_2940,local_28a0);
      auVar162 = vcmpps_avx(auVar147,auVar259,1);
      auVar242 = ZEXT3264(auVar162);
      auVar195 = vdivps_avx(auVar273,local_28a0);
      auVar147 = vandps_avx(local_2940,local_2880);
      auVar147 = vcmpps_avx(auVar147,auVar259,1);
      auVar146 = vdivps_avx(auVar273,local_2880);
      auVar260._8_4_ = 0x5d5e0b6b;
      auVar260._0_8_ = 0x5d5e0b6b5d5e0b6b;
      auVar260._12_4_ = 0x5d5e0b6b;
      auVar260._16_4_ = 0x5d5e0b6b;
      auVar260._20_4_ = 0x5d5e0b6b;
      auVar260._24_4_ = 0x5d5e0b6b;
      auVar260._28_4_ = 0x5d5e0b6b;
      local_2860 = vblendvps_avx(auVar194,auVar260,auVar176);
      local_2840 = vblendvps_avx(auVar195,auVar260,auVar162);
      _local_2820 = vblendvps_avx(auVar146,auVar260,auVar147);
      auVar147 = vcmpps_avx(local_2860,ZEXT1632(auVar175),1);
      auVar176._8_4_ = 0x10;
      auVar176._0_8_ = 0x1000000010;
      auVar176._12_4_ = 0x10;
      auVar176._16_4_ = 0x10;
      auVar176._20_4_ = 0x10;
      auVar176._24_4_ = 0x10;
      auVar176._28_4_ = 0x10;
      local_2800 = vandps_avx(auVar147,auVar176);
      auVar194._8_4_ = 0x20;
      auVar194._0_8_ = 0x2000000020;
      auVar194._12_4_ = 0x20;
      auVar194._16_4_ = 0x20;
      auVar194._20_4_ = 0x20;
      auVar194._24_4_ = 0x20;
      auVar194._28_4_ = 0x20;
      auVar228._8_4_ = 0x30;
      auVar228._0_8_ = 0x3000000030;
      auVar228._12_4_ = 0x30;
      auVar228._16_4_ = 0x30;
      auVar228._20_4_ = 0x30;
      auVar228._24_4_ = 0x30;
      auVar228._28_4_ = 0x30;
      auVar176 = ZEXT1632(auVar175);
      auVar147 = vcmpps_avx(local_2840,auVar176,5);
      local_27e0 = vblendvps_avx(auVar228,auVar194,auVar147);
      auVar195._8_4_ = 0x40;
      auVar195._0_8_ = 0x4000000040;
      auVar195._12_4_ = 0x40;
      auVar195._16_4_ = 0x40;
      auVar195._20_4_ = 0x40;
      auVar195._24_4_ = 0x40;
      auVar195._28_4_ = 0x40;
      auVar146._8_4_ = 0x50;
      auVar146._0_8_ = 0x5000000050;
      auVar146._12_4_ = 0x50;
      auVar146._16_4_ = 0x50;
      auVar146._20_4_ = 0x50;
      auVar146._24_4_ = 0x50;
      auVar146._28_4_ = 0x50;
      auVar147 = vcmpps_avx(_local_2820,auVar176,5);
      local_27c0 = vblendvps_avx(auVar146,auVar195,auVar147);
      auVar147 = vmaxps_avx(*(undefined1 (*) [32])(ray + 0x60),auVar176);
      auVar176 = vmaxps_avx(*(undefined1 (*) [32])(ray + 0x100),auVar176);
      local_2760 = vpmovsxwd_avx2(auVar140);
      auVar162._8_4_ = 0x7f800000;
      auVar162._0_8_ = 0x7f8000007f800000;
      auVar162._12_4_ = 0x7f800000;
      auVar162._16_4_ = 0x7f800000;
      auVar162._20_4_ = 0x7f800000;
      auVar162._24_4_ = 0x7f800000;
      auVar162._28_4_ = 0x7f800000;
      local_27a0 = vblendvps_avx(auVar162,auVar147,local_2760);
      auVar147._8_4_ = 0xff800000;
      auVar147._0_8_ = 0xff800000ff800000;
      auVar147._12_4_ = 0xff800000;
      auVar147._16_4_ = 0xff800000;
      auVar147._20_4_ = 0xff800000;
      auVar147._24_4_ = 0xff800000;
      auVar147._28_4_ = 0xff800000;
      local_2780 = vblendvps_avx(auVar147,auVar176,local_2760);
      auVar175 = vpcmpeqd_avx(local_2780._0_16_,local_2780._0_16_);
      auVar186 = ZEXT1664(auVar175);
      local_2c20 = vpmovsxwd_avx2(auVar140 ^ auVar175);
      local_2c40 = This;
      local_2c48 = (BVH *)This->ptr;
      if (context->user == (RTCRayQueryContext *)0x0) {
        uVar133 = 5;
      }
      else {
        uVar133 = (ulong)((context->args->flags & RTC_RAY_QUERY_FLAG_COHERENT) ==
                         RTC_RAY_QUERY_FLAG_INCOHERENT) * 3 + 2;
      }
      local_2df0 = (RTCIntersectArguments *)(ray + 0x100);
      puVar137 = local_2600;
      local_2610 = 0xfffffffffffffff8;
      pauVar131 = (undefined1 (*) [32])local_1e40;
      local_1e80 = 0x7f800000;
      uStack_1e7c = 0x7f800000;
      uStack_1e78 = 0x7f800000;
      uStack_1e74 = 0x7f800000;
      uStack_1e70 = 0x7f800000;
      uStack_1e6c = 0x7f800000;
      uStack_1e68 = 0x7f800000;
      uStack_1e64 = 0x7f800000;
      local_1e60 = local_27a0;
      local_2720 = mm_lookupmask_ps._16_8_;
      uStack_2718 = mm_lookupmask_ps._24_8_;
      uStack_2710 = mm_lookupmask_ps._16_8_;
      uStack_2708 = mm_lookupmask_ps._24_8_;
      local_2d48 = (undefined1 (*) [32])&local_2b20;
      local_2740 = mm_lookupmask_pd._0_8_;
      uStack_2738 = mm_lookupmask_pd._8_8_;
      uStack_2730 = mm_lookupmask_pd._0_8_;
      uStack_2728 = mm_lookupmask_pd._8_8_;
LAB_015c8505:
      do {
        do {
          root.ptr = puVar137[-1];
          if (root.ptr == 0xfffffffffffffff8) goto LAB_015ca004;
          puVar137 = puVar137 + -1;
          pauVar131 = pauVar131 + -1;
          local_2d80 = *pauVar131;
          auVar172 = ZEXT3264(local_2d80);
          auVar147 = vcmpps_avx(local_2d80,local_2780,1);
        } while ((((((((auVar147 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                      (auVar147 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                     (auVar147 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    SUB321(auVar147 >> 0x7f,0) == '\0') &&
                   (auVar147 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                  SUB321(auVar147 >> 0xbf,0) == '\0') &&
                 (auVar147 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                 -1 < auVar147[0x1f]);
        uVar135 = vmovmskps_avx(auVar147);
        unaff_R12 = (RTCIntersectArguments *)CONCAT44((int)((ulong)unaff_R12 >> 0x20),uVar135);
        if (uVar133 < CONCAT44(0,POPCOUNT(uVar135))) {
LAB_015c8542:
          do {
            iVar125 = 4;
            lVar129 = -0x10;
            uVar136 = (uint)root.ptr;
            if ((root.ptr & 8) != 0) {
              if (root.ptr == 0xfffffffffffffff8) goto LAB_015ca004;
              auVar147 = vcmpps_avx(local_2780,auVar172._0_32_,6);
              if ((((((((auVar147 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                       (auVar147 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                      (auVar147 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                     SUB321(auVar147 >> 0x7f,0) == '\0') &&
                    (auVar147 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                   SUB321(auVar147 >> 0xbf,0) == '\0') &&
                  (auVar147 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                  -1 < auVar147[0x1f]) goto LAB_015c8505;
              pRVar128 = (RTCIntersectArguments *)((ulong)(uVar136 & 0xf) - 8);
              local_2c38 = pRVar128;
              auVar147 = vpcmpeqd_avx2(auVar147,auVar147);
              local_2ae0 = auVar147 ^ local_2c20;
              unaff_R12 = (RTCIntersectArguments *)0x0;
              goto LAB_015c8826;
            }
            uVar127 = root.ptr & 0xfffffffffffffff0;
            auVar147 = vcmpps_avx(local_2780,auVar172._0_32_,6);
            auVar172 = ZEXT3264(CONCAT428(0x7f800000,
                                          CONCAT424(0x7f800000,
                                                    CONCAT420(0x7f800000,
                                                              CONCAT416(0x7f800000,
                                                                        CONCAT412(0x7f800000,
                                                                                  CONCAT48(
                                                  0x7f800000,0x7f8000007f800000)))))));
            root.ptr = 8;
            for (; (auVar176 = auVar172._0_32_, lVar129 != 0 &&
                   (uVar132 = *(ulong *)(uVar127 + 0x20 + lVar129 * 2), uVar132 != 8));
                lVar129 = lVar129 + 4) {
              in_ZMM15 = ZEXT3264(auVar176);
              uVar135 = *(undefined4 *)(uVar127 + 0x90 + lVar129);
              auVar177._4_4_ = uVar135;
              auVar177._0_4_ = uVar135;
              auVar177._8_4_ = uVar135;
              auVar177._12_4_ = uVar135;
              auVar177._16_4_ = uVar135;
              auVar177._20_4_ = uVar135;
              auVar177._24_4_ = uVar135;
              auVar177._28_4_ = uVar135;
              uVar135 = *(undefined4 *)(uVar127 + 0x30 + lVar129);
              auVar196._4_4_ = uVar135;
              auVar196._0_4_ = uVar135;
              auVar196._8_4_ = uVar135;
              auVar196._12_4_ = uVar135;
              auVar196._16_4_ = uVar135;
              auVar196._20_4_ = uVar135;
              auVar196._24_4_ = uVar135;
              auVar196._28_4_ = uVar135;
              auVar162 = *(undefined1 (*) [32])(ray + 0xe0);
              uVar135 = *(undefined4 *)(uVar127 + 0xb0 + lVar129);
              auVar209._4_4_ = uVar135;
              auVar209._0_4_ = uVar135;
              auVar209._8_4_ = uVar135;
              auVar209._12_4_ = uVar135;
              auVar209._16_4_ = uVar135;
              auVar209._20_4_ = uVar135;
              auVar209._24_4_ = uVar135;
              auVar209._28_4_ = uVar135;
              auVar175 = vfmadd231ps_fma(auVar196,auVar162,auVar177);
              uVar135 = *(undefined4 *)(uVar127 + 0x50 + lVar129);
              auVar178._4_4_ = uVar135;
              auVar178._0_4_ = uVar135;
              auVar178._8_4_ = uVar135;
              auVar178._12_4_ = uVar135;
              auVar178._16_4_ = uVar135;
              auVar178._20_4_ = uVar135;
              auVar178._24_4_ = uVar135;
              auVar178._28_4_ = uVar135;
              auVar140 = vfmadd231ps_fma(auVar178,auVar162,auVar209);
              uVar135 = *(undefined4 *)(uVar127 + 0xd0 + lVar129);
              auVar210._4_4_ = uVar135;
              auVar210._0_4_ = uVar135;
              auVar210._8_4_ = uVar135;
              auVar210._12_4_ = uVar135;
              auVar210._16_4_ = uVar135;
              auVar210._20_4_ = uVar135;
              auVar210._24_4_ = uVar135;
              auVar210._28_4_ = uVar135;
              uVar135 = *(undefined4 *)(uVar127 + 0x70 + lVar129);
              auVar222._4_4_ = uVar135;
              auVar222._0_4_ = uVar135;
              auVar222._8_4_ = uVar135;
              auVar222._12_4_ = uVar135;
              auVar222._16_4_ = uVar135;
              auVar222._20_4_ = uVar135;
              auVar222._24_4_ = uVar135;
              auVar222._28_4_ = uVar135;
              uVar135 = *(undefined4 *)(uVar127 + 0xa0 + lVar129);
              auVar229._4_4_ = uVar135;
              auVar229._0_4_ = uVar135;
              auVar229._8_4_ = uVar135;
              auVar229._12_4_ = uVar135;
              auVar229._16_4_ = uVar135;
              auVar229._20_4_ = uVar135;
              auVar229._24_4_ = uVar135;
              auVar229._28_4_ = uVar135;
              uVar135 = *(undefined4 *)(uVar127 + 0x40 + lVar129);
              auVar237._4_4_ = uVar135;
              auVar237._0_4_ = uVar135;
              auVar237._8_4_ = uVar135;
              auVar237._12_4_ = uVar135;
              auVar237._16_4_ = uVar135;
              auVar237._20_4_ = uVar135;
              auVar237._24_4_ = uVar135;
              auVar237._28_4_ = uVar135;
              auVar17 = vfmadd231ps_fma(auVar222,auVar162,auVar210);
              auVar272 = vfmadd231ps_fma(auVar237,auVar162,auVar229);
              uVar135 = *(undefined4 *)(uVar127 + 0xc0 + lVar129);
              auVar211._4_4_ = uVar135;
              auVar211._0_4_ = uVar135;
              auVar211._8_4_ = uVar135;
              auVar211._12_4_ = uVar135;
              auVar211._16_4_ = uVar135;
              auVar211._20_4_ = uVar135;
              auVar211._24_4_ = uVar135;
              auVar211._28_4_ = uVar135;
              uVar135 = *(undefined4 *)(uVar127 + 0x60 + lVar129);
              auVar230._4_4_ = uVar135;
              auVar230._0_4_ = uVar135;
              auVar230._8_4_ = uVar135;
              auVar230._12_4_ = uVar135;
              auVar230._16_4_ = uVar135;
              auVar230._20_4_ = uVar135;
              auVar230._24_4_ = uVar135;
              auVar230._28_4_ = uVar135;
              uVar135 = *(undefined4 *)(uVar127 + 0xe0 + lVar129);
              auVar253._4_4_ = uVar135;
              auVar253._0_4_ = uVar135;
              auVar253._8_4_ = uVar135;
              auVar253._12_4_ = uVar135;
              auVar253._16_4_ = uVar135;
              auVar253._20_4_ = uVar135;
              auVar253._24_4_ = uVar135;
              auVar253._28_4_ = uVar135;
              auVar18 = vfmadd231ps_fma(auVar230,auVar162,auVar211);
              uVar135 = *(undefined4 *)(uVar127 + 0x80 + lVar129);
              auVar212._4_4_ = uVar135;
              auVar212._0_4_ = uVar135;
              auVar212._8_4_ = uVar135;
              auVar212._12_4_ = uVar135;
              auVar212._16_4_ = uVar135;
              auVar212._20_4_ = uVar135;
              auVar212._24_4_ = uVar135;
              auVar212._28_4_ = uVar135;
              auVar19 = vfmadd231ps_fma(auVar212,auVar162,auVar253);
              auVar75._8_8_ = local_2920._8_8_;
              auVar75._0_8_ = local_2920._0_8_;
              auVar75._16_8_ = local_2920._16_8_;
              auVar75._24_8_ = local_2920._24_8_;
              auVar76._8_8_ = local_2920._40_8_;
              auVar76._0_8_ = local_2920._32_8_;
              auVar76._16_8_ = local_2920._48_8_;
              auVar76._24_8_ = local_2920._56_8_;
              auVar77._8_8_ = local_2920._72_8_;
              auVar77._0_8_ = local_2920._64_8_;
              auVar77._16_8_ = local_2920._80_8_;
              auVar77._24_8_ = local_2920._88_8_;
              auVar265 = ZEXT3264(auVar77);
              auVar274 = ZEXT3264(local_2860);
              auVar194 = vsubps_avx(ZEXT1632(auVar175),auVar75);
              auVar21._4_4_ = local_2860._4_4_ * auVar194._4_4_;
              auVar21._0_4_ = local_2860._0_4_ * auVar194._0_4_;
              auVar21._8_4_ = local_2860._8_4_ * auVar194._8_4_;
              auVar21._12_4_ = local_2860._12_4_ * auVar194._12_4_;
              auVar21._16_4_ = local_2860._16_4_ * auVar194._16_4_;
              auVar21._20_4_ = local_2860._20_4_ * auVar194._20_4_;
              auVar21._24_4_ = local_2860._24_4_ * auVar194._24_4_;
              auVar21._28_4_ = auVar194._28_4_;
              auVar194 = vsubps_avx(ZEXT1632(auVar140),auVar76);
              in_ZMM12 = ZEXT3264(local_2840);
              auVar277._0_4_ = local_2840._0_4_ * auVar194._0_4_;
              auVar277._4_4_ = local_2840._4_4_ * auVar194._4_4_;
              auVar277._8_4_ = local_2840._8_4_ * auVar194._8_4_;
              auVar277._12_4_ = local_2840._12_4_ * auVar194._12_4_;
              auVar277._16_4_ = local_2840._16_4_ * auVar194._16_4_;
              auVar277._20_4_ = local_2840._20_4_ * auVar194._20_4_;
              auVar277._28_36_ = in_ZMM13._28_36_;
              auVar277._24_4_ = local_2840._24_4_ * auVar194._24_4_;
              auVar146 = auVar277._0_32_;
              in_ZMM13 = ZEXT3264(auVar146);
              auVar194 = vsubps_avx(ZEXT1632(auVar17),auVar77);
              auVar279._0_4_ = auVar194._0_4_ * (float)local_2820._0_4_;
              auVar279._4_4_ = auVar194._4_4_ * (float)local_2820._4_4_;
              auVar279._8_4_ = auVar194._8_4_ * fStack_2818;
              auVar279._12_4_ = auVar194._12_4_ * fStack_2814;
              auVar279._16_4_ = auVar194._16_4_ * fStack_2810;
              auVar279._20_4_ = auVar194._20_4_ * fStack_280c;
              auVar279._28_36_ = in_ZMM14._28_36_;
              auVar279._24_4_ = auVar194._24_4_ * fStack_2808;
              auVar228 = auVar279._0_32_;
              in_ZMM14 = ZEXT3264(auVar228);
              auVar194 = vsubps_avx(ZEXT1632(auVar272),auVar75);
              auVar238._0_4_ = local_2860._0_4_ * auVar194._0_4_;
              auVar238._4_4_ = local_2860._4_4_ * auVar194._4_4_;
              auVar238._8_4_ = local_2860._8_4_ * auVar194._8_4_;
              auVar238._12_4_ = local_2860._12_4_ * auVar194._12_4_;
              auVar238._16_4_ = local_2860._16_4_ * auVar194._16_4_;
              auVar238._20_4_ = local_2860._20_4_ * auVar194._20_4_;
              auVar238._24_4_ = local_2860._24_4_ * auVar194._24_4_;
              auVar238._28_4_ = 0;
              auVar242 = ZEXT3264(auVar238);
              auVar194 = vsubps_avx(ZEXT1632(auVar18),auVar76);
              auVar231._0_4_ = local_2840._0_4_ * auVar194._0_4_;
              auVar231._4_4_ = local_2840._4_4_ * auVar194._4_4_;
              auVar231._8_4_ = local_2840._8_4_ * auVar194._8_4_;
              auVar231._12_4_ = local_2840._12_4_ * auVar194._12_4_;
              auVar231._16_4_ = local_2840._16_4_ * auVar194._16_4_;
              auVar231._20_4_ = local_2840._20_4_ * auVar194._20_4_;
              auVar231._24_4_ = local_2840._24_4_ * auVar194._24_4_;
              auVar231._28_4_ = 0;
              auVar194 = vsubps_avx(ZEXT1632(auVar19),auVar77);
              auVar213._0_4_ = auVar194._0_4_ * (float)local_2820._0_4_;
              auVar213._4_4_ = auVar194._4_4_ * (float)local_2820._4_4_;
              auVar213._8_4_ = auVar194._8_4_ * fStack_2818;
              auVar213._12_4_ = auVar194._12_4_ * fStack_2814;
              auVar213._16_4_ = auVar194._16_4_ * fStack_2810;
              auVar213._20_4_ = auVar194._20_4_ * fStack_280c;
              auVar213._24_4_ = auVar194._24_4_ * fStack_2808;
              auVar213._28_4_ = 0;
              auVar194 = vpminsd_avx2(auVar21,auVar238);
              auVar195 = vpminsd_avx2(auVar146,auVar231);
              auVar194 = vpmaxsd_avx2(auVar194,auVar195);
              auVar195 = vpminsd_avx2(auVar228,auVar213);
              auVar194 = vpmaxsd_avx2(auVar194,auVar195);
              auVar22._4_4_ = auVar194._4_4_ * 0.99999964;
              auVar22._0_4_ = auVar194._0_4_ * 0.99999964;
              auVar22._8_4_ = auVar194._8_4_ * 0.99999964;
              auVar22._12_4_ = auVar194._12_4_ * 0.99999964;
              auVar22._16_4_ = auVar194._16_4_ * 0.99999964;
              auVar22._20_4_ = auVar194._20_4_ * 0.99999964;
              auVar22._24_4_ = auVar194._24_4_ * 0.99999964;
              auVar22._28_4_ = auVar194._28_4_;
              auVar186 = ZEXT3264(auVar22);
              auVar194 = vpmaxsd_avx2(auVar21,auVar238);
              auVar195 = vpmaxsd_avx2(auVar146,auVar231);
              auVar195 = vpminsd_avx2(auVar194,auVar195);
              auVar194 = vpmaxsd_avx2(auVar228,auVar213);
              auVar194 = vpminsd_avx2(auVar195,auVar194);
              auVar23._4_4_ = auVar194._4_4_ * 1.0000004;
              auVar23._0_4_ = auVar194._0_4_ * 1.0000004;
              auVar23._8_4_ = auVar194._8_4_ * 1.0000004;
              auVar23._12_4_ = auVar194._12_4_ * 1.0000004;
              auVar23._16_4_ = auVar194._16_4_ * 1.0000004;
              auVar23._20_4_ = auVar194._20_4_ * 1.0000004;
              auVar23._24_4_ = auVar194._24_4_ * 1.0000004;
              auVar23._28_4_ = auVar194._28_4_;
              auVar194 = vpmaxsd_avx2(auVar22,local_27a0);
              auVar195 = vpminsd_avx2(auVar23,local_2780);
              auVar194 = vcmpps_avx(auVar194,auVar195,2);
              if ((uVar136 & 7) == 6) {
                uVar135 = *(undefined4 *)(uVar127 + 0xf0 + lVar129);
                auVar214._4_4_ = uVar135;
                auVar214._0_4_ = uVar135;
                auVar214._8_4_ = uVar135;
                auVar214._12_4_ = uVar135;
                auVar214._16_4_ = uVar135;
                auVar214._20_4_ = uVar135;
                auVar214._24_4_ = uVar135;
                auVar214._28_4_ = uVar135;
                auVar195 = vcmpps_avx(auVar214,auVar162,2);
                uVar135 = *(undefined4 *)(uVar127 + 0x100 + lVar129);
                auVar223._4_4_ = uVar135;
                auVar223._0_4_ = uVar135;
                auVar223._8_4_ = uVar135;
                auVar223._12_4_ = uVar135;
                auVar223._16_4_ = uVar135;
                auVar223._20_4_ = uVar135;
                auVar223._24_4_ = uVar135;
                auVar223._28_4_ = uVar135;
                auVar162 = vcmpps_avx(auVar162,auVar223,1);
                auVar162 = vandps_avx(auVar195,auVar162);
                auVar162 = vandps_avx(auVar162,auVar194);
                auVar175 = vpackssdw_avx(auVar162._0_16_,auVar162._16_16_);
              }
              else {
                auVar175 = vpackssdw_avx(auVar194._0_16_,auVar194._16_16_);
              }
              auVar140 = vpackssdw_avx(auVar147._0_16_,auVar147._16_16_);
              auVar175 = vpand_avx(auVar175,auVar140);
              auVar162 = vpmovzxwd_avx2(auVar175);
              auVar162 = vpslld_avx2(auVar162,0x1f);
              if ((((((((auVar162 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                       (auVar162 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                      (auVar162 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                     SUB321(auVar162 >> 0x7f,0) == '\0') &&
                    (auVar162 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                   SUB321(auVar162 >> 0xbf,0) == '\0') &&
                  (auVar162 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                  -1 < auVar162[0x1f]) {
                auVar172 = ZEXT3264(auVar176);
                uVar132 = root.ptr;
              }
              else {
                auVar197._8_4_ = 0x7f800000;
                auVar197._0_8_ = 0x7f8000007f800000;
                auVar197._12_4_ = 0x7f800000;
                auVar197._16_4_ = 0x7f800000;
                auVar197._20_4_ = 0x7f800000;
                auVar197._24_4_ = 0x7f800000;
                auVar197._28_4_ = 0x7f800000;
                auVar162 = vblendvps_avx(auVar197,auVar22,auVar162);
                auVar172 = ZEXT3264(auVar162);
                if (root.ptr != 8) {
                  *puVar137 = root.ptr;
                  puVar137 = puVar137 + 1;
                  *pauVar131 = auVar176;
                  pauVar131 = pauVar131 + 1;
                }
              }
              root.ptr = uVar132;
            }
            if (root.ptr == 8) goto LAB_015c87c6;
            auVar147 = vcmpps_avx(local_2780,auVar176,6);
            uVar135 = vmovmskps_avx(auVar147);
          } while ((byte)uVar133 < (byte)POPCOUNT(uVar135));
          *puVar137 = root.ptr;
          puVar137 = puVar137 + 1;
          *pauVar131 = auVar176;
          pauVar131 = pauVar131 + 1;
        }
        else {
          local_2e40 = (undefined1  [8])CONCAT44(0,POPCOUNT(uVar135));
          while (unaff_R12 != (RTCIntersectArguments *)0x0) {
            k = 0;
            for (pRVar128 = unaff_R12; ((ulong)pRVar128 & 1) == 0;
                pRVar128 = (RTCIntersectArguments *)((ulong)pRVar128 >> 1 | 0x8000000000000000)) {
              k = k + 1;
            }
            unaff_R12 = (RTCIntersectArguments *)
                        ((ulong)((long)&unaff_R12[-1].intersect + 7) & (ulong)unaff_R12);
            local_2e20._0_8_ = k;
            auVar186 = ZEXT1664(auVar186._0_16_);
            auVar242 = ZEXT1664(auVar242._0_16_);
            auVar265 = ZEXT1664(auVar265._0_16_);
            auVar274 = ZEXT1664(auVar274._0_16_);
            in_ZMM12 = ZEXT1664(in_ZMM12._0_16_);
            in_ZMM13 = ZEXT1664(in_ZMM13._0_16_);
            in_ZMM14 = ZEXT1664(in_ZMM14._0_16_);
            in_ZMM15 = ZEXT1664(in_ZMM15._0_16_);
            bVar124 = occluded1(local_2c40,local_2c48,root,k,&local_2e81,ray,
                                (TravRayK<8,_true> *)&local_2920.field_0,context);
            if (bVar124) {
              *(undefined4 *)(local_2c20 + local_2e20._0_8_ * 4) = 0xffffffff;
            }
          }
          auVar147 = _DAT_01f7b020 & ~local_2c20;
          iVar125 = 3;
          if ((((((((auVar147 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar147 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar147 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar147 >> 0x7f,0) != '\0') ||
                (auVar147 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar147 >> 0xbf,0) != '\0') ||
              (auVar147 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar147[0x1f] < '\0') {
            auVar185._8_4_ = 0xff800000;
            auVar185._0_8_ = 0xff800000ff800000;
            auVar185._12_4_ = 0xff800000;
            auVar185._16_4_ = 0xff800000;
            auVar185._20_4_ = 0xff800000;
            auVar185._24_4_ = 0xff800000;
            auVar185._28_4_ = 0xff800000;
            auVar186 = ZEXT3264(auVar185);
            local_2780 = vblendvps_avx(local_2780,auVar185,local_2c20);
            iVar125 = 2;
          }
          auVar172 = ZEXT3264(local_2d80);
          unaff_R12 = (RTCIntersectArguments *)0x0;
          if ((uint)uVar133 < (uint)local_2e40._0_4_) goto LAB_015c8542;
        }
LAB_015c87c6:
      } while (iVar125 != 3);
LAB_015ca004:
      auVar147 = vandps_avx(local_2760,local_2c20);
      auVar171._8_4_ = 0xff800000;
      auVar171._0_8_ = 0xff800000ff800000;
      auVar171._12_4_ = 0xff800000;
      auVar171._16_4_ = 0xff800000;
      auVar171._20_4_ = 0xff800000;
      auVar171._24_4_ = 0xff800000;
      auVar171._28_4_ = 0xff800000;
      RVar6 = (RTCIntersectArguments)vmaskmovps_avx(auVar147,auVar171);
      *local_2df0 = RVar6;
    }
  }
  return;
LAB_015c8826:
  do {
    auVar147 = auVar186._0_32_;
    if (unaff_R12 == local_2c38) break;
    lVar129 = (long)unaff_R12 * 0x60 + (root.ptr & 0xfffffffffffffff0);
    uVar126 = vmovmskps_avx(local_2ae0);
    uVar127 = CONCAT44((int)((ulong)pRVar128 >> 0x20),uVar126);
    uVar136 = 0;
    for (; (uVar126 & 1) == 0; uVar126 = uVar126 >> 1 | 0x80000000) {
      uVar136 = uVar136 + 1;
    }
    local_2c28 = (ulong)uVar136;
    local_2e48 = uVar127;
    pRVar128 = (RTCIntersectArguments *)0x0;
    for (; (uVar127 & 1) == 0; uVar127 = uVar127 >> 1 | 0x8000000000000000) {
      pRVar128 = (RTCIntersectArguments *)((long)&pRVar128->flags + 1);
    }
    local_2e50 = pRVar128;
    auVar186 = ZEXT3264(local_2ae0);
    for (lVar134 = 0; auVar176 = auVar186._0_32_, lVar134 != 4; lVar134 = lVar134 + 1) {
      iVar125 = *(int *)(lVar129 + 0x50 + lVar134 * 4);
      pRVar128 = (RTCIntersectArguments *)0x0;
      if (iVar125 == -1) break;
      local_2de4 = iVar125;
      local_2c30 = (ulong)*(uint *)(lVar129 + 0x40 + lVar134 * 4);
      pGVar11 = (context->scene->geometries).items[local_2c30].ptr;
      BVar5 = pGVar11->time_range;
      auVar140._8_8_ = 0;
      auVar140._0_4_ = BVar5.lower;
      auVar140._4_4_ = BVar5.upper;
      fVar138 = BVar5.lower;
      auVar163._4_4_ = fVar138;
      auVar163._0_4_ = fVar138;
      auVar163._8_4_ = fVar138;
      auVar163._12_4_ = fVar138;
      auVar163._16_4_ = fVar138;
      auVar163._20_4_ = fVar138;
      auVar163._24_4_ = fVar138;
      auVar163._28_4_ = fVar138;
      auVar147 = vsubps_avx(*(undefined1 (*) [32])(ray + 0xe0),auVar163);
      auVar175 = vmovshdup_avx(auVar140);
      auVar175 = vsubps_avx(auVar175,auVar140);
      auVar141._0_4_ = auVar175._0_4_;
      auVar141._4_4_ = auVar141._0_4_;
      auVar141._8_4_ = auVar141._0_4_;
      auVar141._12_4_ = auVar141._0_4_;
      auVar141._16_4_ = auVar141._0_4_;
      auVar141._20_4_ = auVar141._0_4_;
      auVar141._24_4_ = auVar141._0_4_;
      auVar141._28_4_ = auVar141._0_4_;
      auVar147 = vdivps_avx(auVar147,auVar141);
      fVar138 = pGVar11->fnumTimeSegments;
      auVar16._4_4_ = fVar138 * auVar147._4_4_;
      auVar16._0_4_ = fVar138 * auVar147._0_4_;
      auVar16._8_4_ = fVar138 * auVar147._8_4_;
      auVar16._12_4_ = fVar138 * auVar147._12_4_;
      auVar16._16_4_ = fVar138 * auVar147._16_4_;
      auVar16._20_4_ = fVar138 * auVar147._20_4_;
      auVar16._24_4_ = fVar138 * auVar147._24_4_;
      auVar16._28_4_ = auVar147._28_4_;
      auVar147 = vroundps_avx(auVar16,1);
      fVar138 = fVar138 + -1.0;
      auVar164._4_4_ = fVar138;
      auVar164._0_4_ = fVar138;
      auVar164._8_4_ = fVar138;
      auVar164._12_4_ = fVar138;
      auVar164._16_4_ = fVar138;
      auVar164._20_4_ = fVar138;
      auVar164._24_4_ = fVar138;
      auVar164._28_4_ = fVar138;
      auVar147 = vminps_avx(auVar147,auVar164);
      auVar147 = vmaxps_avx(auVar147,_DAT_01f7b000);
      auVar162 = vsubps_avx(auVar16,auVar147);
      auVar147 = vcvtps2dq_avx(auVar147);
      local_2e80.valid = (int *)auVar147._0_8_;
      local_2e80.geometryUserPtr = (void *)auVar147._8_8_;
      local_2e80.context = (RTCRayQueryContext *)auVar147._16_8_;
      local_2e80.ray = (RTCRayN *)auVar147._24_8_;
      iVar125 = *(int *)((long)&local_2e80.valid + local_2c28 * 4);
      auVar179._4_4_ = iVar125;
      auVar179._0_4_ = iVar125;
      auVar179._8_4_ = iVar125;
      auVar179._12_4_ = iVar125;
      auVar179._16_4_ = iVar125;
      auVar179._20_4_ = iVar125;
      auVar179._24_4_ = iVar125;
      auVar179._28_4_ = iVar125;
      auVar147 = vpcmpeqd_avx2(auVar179,auVar147);
      auVar147 = local_2ae0 & ~auVar147;
      local_2e20 = auVar176;
      local_2ca0._0_8_ = pGVar11;
      fVar153 = auVar162._4_4_;
      fVar155 = auVar162._8_4_;
      fVar157 = auVar162._12_4_;
      fVar159 = auVar162._16_4_;
      fVar160 = auVar162._20_4_;
      fVar161 = auVar162._24_4_;
      fVar138 = auVar162._0_4_;
      auVar287._28_36_ = in_ZMM15._28_36_;
      auVar172._28_36_ = in_ZMM12._28_36_;
      uVar127 = local_2e48;
      pRVar128 = local_2e50;
      if ((((((((auVar147 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (auVar147 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (auVar147 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(auVar147 >> 0x7f,0) == '\0') &&
            (auVar147 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
           SUB321(auVar147 >> 0xbf,0) == '\0') &&
          (auVar147 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
          -1 < auVar147[0x1f]) {
        pRVar128 = *(RTCIntersectArguments **)
                    (*(long *)&pGVar11[2].numPrimitives + (long)iVar125 * 0x38);
        lVar130 = *(long *)(*(long *)&pGVar11[2].numPrimitives + 0x38 + (long)iVar125 * 0x38);
        uVar127 = (ulong)*(uint *)(lVar129 + lVar134 * 4);
        RVar3 = (&pRVar128->flags)[uVar127];
        auVar224._4_4_ = RVar3;
        auVar224._0_4_ = RVar3;
        auVar224._8_4_ = RVar3;
        auVar224._12_4_ = RVar3;
        auVar224._16_4_ = RVar3;
        auVar224._20_4_ = RVar3;
        auVar224._24_4_ = RVar3;
        auVar224._28_4_ = RVar3;
        RVar4 = (&pRVar128->feature_mask)[uVar127];
        auVar232._4_4_ = RVar4;
        auVar232._0_4_ = RVar4;
        auVar232._8_4_ = RVar4;
        auVar232._12_4_ = RVar4;
        auVar232._16_4_ = RVar4;
        auVar232._20_4_ = RVar4;
        auVar232._24_4_ = RVar4;
        auVar232._28_4_ = RVar4;
        uVar135 = *(undefined4 *)((long)&pRVar128->context + uVar127 * 4);
        auVar239._4_4_ = uVar135;
        auVar239._0_4_ = uVar135;
        auVar239._8_4_ = uVar135;
        auVar239._12_4_ = uVar135;
        auVar239._16_4_ = uVar135;
        auVar239._20_4_ = uVar135;
        auVar239._24_4_ = uVar135;
        auVar239._28_4_ = uVar135;
        fVar139 = *(float *)(lVar130 + uVar127 * 4);
        fVar154 = *(float *)(lVar130 + 4 + uVar127 * 4);
        fVar156 = *(float *)(lVar130 + 8 + uVar127 * 4);
        uVar127 = (ulong)*(uint *)(lVar129 + 0x10 + lVar134 * 4);
        auVar180._8_4_ = 0x3f800000;
        auVar180._0_8_ = 0x3f8000003f800000;
        auVar180._12_4_ = 0x3f800000;
        auVar180._16_4_ = 0x3f800000;
        auVar180._20_4_ = 0x3f800000;
        auVar180._24_4_ = 0x3f800000;
        auVar180._28_4_ = 0x3f800000;
        auVar147 = vsubps_avx(auVar180,auVar162);
        auVar274._0_4_ = fVar138 * fVar139;
        auVar274._4_4_ = fVar153 * fVar139;
        auVar274._8_4_ = fVar155 * fVar139;
        auVar274._12_4_ = fVar157 * fVar139;
        auVar274._16_4_ = fVar159 * fVar139;
        auVar274._20_4_ = fVar160 * fVar139;
        auVar274._24_4_ = fVar161 * fVar139;
        auVar287._0_4_ = fVar138 * fVar154;
        auVar287._4_4_ = fVar153 * fVar154;
        auVar287._8_4_ = fVar155 * fVar154;
        auVar287._12_4_ = fVar157 * fVar154;
        auVar287._16_4_ = fVar159 * fVar154;
        auVar287._20_4_ = fVar160 * fVar154;
        auVar287._24_4_ = fVar161 * fVar154;
        auVar24._4_4_ = fVar156 * fVar153;
        auVar24._0_4_ = fVar156 * fVar138;
        auVar24._8_4_ = fVar156 * fVar155;
        auVar24._12_4_ = fVar156 * fVar157;
        auVar24._16_4_ = fVar156 * fVar159;
        auVar24._20_4_ = fVar156 * fVar160;
        auVar24._24_4_ = fVar156 * fVar161;
        auVar24._28_4_ = fVar154;
        auVar175 = vfmadd231ps_fma(auVar274._0_32_,auVar147,auVar224);
        auVar275 = ZEXT1664(auVar175);
        auVar175 = vfmadd231ps_fma(auVar287._0_32_,auVar147,auVar232);
        auVar274 = ZEXT1664(auVar175);
        auVar175 = vfmadd231ps_fma(auVar24,auVar147,auVar239);
        auVar220 = ZEXT1632(auVar175);
        RVar3 = (&pRVar128->flags)[uVar127];
        auVar225._4_4_ = RVar3;
        auVar225._0_4_ = RVar3;
        auVar225._8_4_ = RVar3;
        auVar225._12_4_ = RVar3;
        auVar225._16_4_ = RVar3;
        auVar225._20_4_ = RVar3;
        auVar225._24_4_ = RVar3;
        auVar225._28_4_ = RVar3;
        RVar4 = (&pRVar128->feature_mask)[uVar127];
        auVar233._4_4_ = RVar4;
        auVar233._0_4_ = RVar4;
        auVar233._8_4_ = RVar4;
        auVar233._12_4_ = RVar4;
        auVar233._16_4_ = RVar4;
        auVar233._20_4_ = RVar4;
        auVar233._24_4_ = RVar4;
        auVar233._28_4_ = RVar4;
        uVar135 = *(undefined4 *)((long)&pRVar128->context + uVar127 * 4);
        auVar240._4_4_ = uVar135;
        auVar240._0_4_ = uVar135;
        auVar240._8_4_ = uVar135;
        auVar240._12_4_ = uVar135;
        auVar240._16_4_ = uVar135;
        auVar240._20_4_ = uVar135;
        auVar240._24_4_ = uVar135;
        auVar240._28_4_ = uVar135;
        fVar154 = *(float *)(lVar130 + uVar127 * 4);
        fVar156 = *(float *)(lVar130 + 4 + uVar127 * 4);
        fVar158 = *(float *)(lVar130 + 8 + uVar127 * 4);
        auVar25._4_4_ = fVar154 * fVar153;
        auVar25._0_4_ = fVar154 * fVar138;
        auVar25._8_4_ = fVar154 * fVar155;
        auVar25._12_4_ = fVar154 * fVar157;
        auVar25._16_4_ = fVar154 * fVar159;
        auVar25._20_4_ = fVar154 * fVar160;
        auVar25._24_4_ = fVar154 * fVar161;
        auVar25._28_4_ = fVar154;
        auVar26._4_4_ = fVar156 * fVar153;
        auVar26._0_4_ = fVar156 * fVar138;
        auVar26._8_4_ = fVar156 * fVar155;
        auVar26._12_4_ = fVar156 * fVar157;
        auVar26._16_4_ = fVar156 * fVar159;
        auVar26._20_4_ = fVar156 * fVar160;
        auVar26._24_4_ = fVar156 * fVar161;
        auVar26._28_4_ = 0x3f800000;
        auVar27._4_4_ = fVar158 * fVar153;
        auVar27._0_4_ = fVar158 * fVar138;
        auVar27._8_4_ = fVar158 * fVar155;
        auVar27._12_4_ = fVar158 * fVar157;
        auVar27._16_4_ = fVar158 * fVar159;
        auVar27._20_4_ = fVar158 * fVar160;
        auVar27._24_4_ = fVar158 * fVar161;
        auVar27._28_4_ = fVar139;
        auVar175 = vfmadd231ps_fma(auVar25,auVar147,auVar225);
        _local_2cc0 = ZEXT1632(auVar175);
        auVar175 = vfmadd231ps_fma(auVar26,auVar147,auVar233);
        _local_2da0 = ZEXT1632(auVar175);
        uVar127 = (ulong)*(uint *)(lVar129 + 0x20 + lVar134 * 4);
        RVar3 = (&pRVar128->flags)[uVar127];
        auVar226._4_4_ = RVar3;
        auVar226._0_4_ = RVar3;
        auVar226._8_4_ = RVar3;
        auVar226._12_4_ = RVar3;
        auVar226._16_4_ = RVar3;
        auVar226._20_4_ = RVar3;
        auVar226._24_4_ = RVar3;
        auVar226._28_4_ = RVar3;
        RVar4 = (&pRVar128->feature_mask)[uVar127];
        auVar234._4_4_ = RVar4;
        auVar234._0_4_ = RVar4;
        auVar234._8_4_ = RVar4;
        auVar234._12_4_ = RVar4;
        auVar234._16_4_ = RVar4;
        auVar234._20_4_ = RVar4;
        auVar234._24_4_ = RVar4;
        auVar234._28_4_ = RVar4;
        uVar135 = *(undefined4 *)((long)&pRVar128->context + uVar127 * 4);
        auVar254._4_4_ = uVar135;
        auVar254._0_4_ = uVar135;
        auVar254._8_4_ = uVar135;
        auVar254._12_4_ = uVar135;
        auVar254._16_4_ = uVar135;
        auVar254._20_4_ = uVar135;
        auVar254._24_4_ = uVar135;
        auVar254._28_4_ = uVar135;
        fVar139 = *(float *)(lVar130 + uVar127 * 4);
        fVar154 = *(float *)(lVar130 + 4 + uVar127 * 4);
        auVar175 = vfmadd231ps_fma(auVar27,auVar147,auVar240);
        _local_2e40 = ZEXT1632(auVar175);
        fVar156 = *(float *)(lVar130 + 8 + uVar127 * 4);
        auVar172._0_4_ = fVar139 * fVar138;
        auVar172._4_4_ = fVar139 * fVar153;
        auVar172._8_4_ = fVar139 * fVar155;
        auVar172._12_4_ = fVar139 * fVar157;
        auVar172._16_4_ = fVar139 * fVar159;
        auVar172._20_4_ = fVar139 * fVar160;
        auVar172._24_4_ = fVar139 * fVar161;
        auVar28._4_4_ = fVar154 * fVar153;
        auVar28._0_4_ = fVar154 * fVar138;
        auVar28._8_4_ = fVar154 * fVar155;
        auVar28._12_4_ = fVar154 * fVar157;
        auVar28._16_4_ = fVar154 * fVar159;
        auVar28._20_4_ = fVar154 * fVar160;
        auVar28._24_4_ = fVar154 * fVar161;
        auVar28._28_4_ = fVar139;
        auVar29._4_4_ = fVar153 * fVar156;
        auVar29._0_4_ = fVar138 * fVar156;
        auVar29._8_4_ = fVar155 * fVar156;
        auVar29._12_4_ = fVar157 * fVar156;
        auVar29._16_4_ = fVar159 * fVar156;
        auVar29._20_4_ = fVar160 * fVar156;
        auVar29._24_4_ = fVar161 * fVar156;
        auVar29._28_4_ = fVar156;
        auVar175 = vfmadd231ps_fma(auVar172._0_32_,auVar147,auVar226);
        _local_29a0 = ZEXT1632(auVar175);
        auVar175 = vfmadd231ps_fma(auVar28,auVar147,auVar234);
        _local_2960 = ZEXT1632(auVar175);
        auVar175 = vfmadd231ps_fma(auVar29,auVar147,auVar254);
        _local_2980 = ZEXT1632(auVar175);
        uVar127 = (ulong)*(uint *)(lVar129 + 0x30 + lVar134 * 4);
        RVar3 = (&pRVar128->flags)[uVar127];
        auVar227._4_4_ = RVar3;
        auVar227._0_4_ = RVar3;
        auVar227._8_4_ = RVar3;
        auVar227._12_4_ = RVar3;
        auVar227._16_4_ = RVar3;
        auVar227._20_4_ = RVar3;
        auVar227._24_4_ = RVar3;
        auVar227._28_4_ = RVar3;
        fVar139 = *(float *)(lVar130 + uVar127 * 4);
        fVar156 = *(float *)(lVar130 + 4 + uVar127 * 4);
        fVar158 = *(float *)(lVar130 + 8 + uVar127 * 4);
        auVar30._4_4_ = fVar153 * fVar139;
        auVar30._0_4_ = fVar138 * fVar139;
        auVar30._8_4_ = fVar155 * fVar139;
        auVar30._12_4_ = fVar157 * fVar139;
        auVar30._16_4_ = fVar159 * fVar139;
        auVar30._20_4_ = fVar160 * fVar139;
        auVar30._24_4_ = fVar161 * fVar139;
        auVar30._28_4_ = fVar154;
        auVar31._4_4_ = fVar153 * fVar156;
        auVar31._0_4_ = fVar138 * fVar156;
        auVar31._8_4_ = fVar155 * fVar156;
        auVar31._12_4_ = fVar157 * fVar156;
        auVar31._16_4_ = fVar159 * fVar156;
        auVar31._20_4_ = fVar160 * fVar156;
        auVar31._24_4_ = fVar161 * fVar156;
        auVar31._28_4_ = fVar156;
        auVar261._0_4_ = fVar158 * fVar138;
        auVar261._4_4_ = fVar158 * fVar153;
        auVar261._8_4_ = fVar158 * fVar155;
        auVar261._12_4_ = fVar158 * fVar157;
        auVar261._16_4_ = fVar158 * fVar159;
        auVar261._20_4_ = fVar158 * fVar160;
        auVar261._24_4_ = fVar158 * fVar161;
        auVar261._28_4_ = 0;
        auVar175 = vfmadd231ps_fma(auVar30,auVar147,auVar227);
        local_2640 = ZEXT1632(auVar175);
        RVar4 = (&pRVar128->feature_mask)[uVar127];
        auVar142._4_4_ = RVar4;
        auVar142._0_4_ = RVar4;
        auVar142._8_4_ = RVar4;
        auVar142._12_4_ = RVar4;
        auVar142._16_4_ = RVar4;
        auVar142._20_4_ = RVar4;
        auVar142._24_4_ = RVar4;
        auVar142._28_4_ = RVar4;
        auVar175 = vfmadd231ps_fma(auVar31,auVar147,auVar142);
        local_2660 = ZEXT1632(auVar175);
        uVar135 = *(undefined4 *)((long)&pRVar128->context + uVar127 * 4);
        auVar143._4_4_ = uVar135;
        auVar143._0_4_ = uVar135;
        auVar143._8_4_ = uVar135;
        auVar143._12_4_ = uVar135;
        auVar143._16_4_ = uVar135;
        auVar143._20_4_ = uVar135;
        auVar143._24_4_ = uVar135;
        auVar143._28_4_ = uVar135;
        auVar175 = vfmadd231ps_fma(auVar261,auVar147,auVar143);
        local_2680 = ZEXT1632(auVar175);
      }
      else {
        while (fVar174 = fStack_2d24, fVar245 = fStack_2d28, fVar244 = fStack_2d2c,
              fVar243 = fStack_2d30, fVar158 = local_2d40[3], fVar156 = local_2d40[2],
              fVar154 = local_2d40[1], fVar139 = local_2d40[0], uVar127 != 0) {
          lVar130 = (long)*(int *)((long)&local_2e80.valid + (long)pRVar128 * 4) * 0x38;
          uVar132 = (ulong)*(uint *)(lVar129 + lVar134 * 4);
          auVar175 = *(undefined1 (*) [16])
                      (*(long *)(*(long *)(local_2ca0._0_8_ + 0xe0) + lVar130) + uVar132 * 4);
          pfVar2 = (float *)(*(long *)(*(long *)(local_2ca0._0_8_ + 0xe0) + 0x38 + lVar130) +
                            uVar132 * 4);
          fVar139 = *pfVar2;
          fVar154 = pfVar2[1];
          fVar156 = pfVar2[2];
          *(int *)((long)&local_2c00 + (long)pRVar128 * 4) = auVar175._0_4_;
          uVar135 = vextractps_avx(auVar175,1);
          *(undefined4 *)((long)&local_2c00 + (long)pRVar128 * 4 + 0x20) = uVar135;
          uVar135 = vextractps_avx(auVar175,2);
          *(undefined4 *)((long)&local_2c00 + (long)pRVar128 * 4 + 0x40) = uVar135;
          local_2d40[(long)pRVar128] = fVar139;
          local_2d20[(long)pRVar128] = fVar154;
          local_2d00[(long)pRVar128] = fVar156;
          uVar132 = (ulong)pRVar128 & 0x3f;
          pRVar128 = (RTCIntersectArguments *)0x0;
          uVar127 = uVar127 ^ 1L << uVar132;
          for (uVar132 = uVar127; (uVar132 & 1) == 0; uVar132 = uVar132 >> 1 | 0x8000000000000000) {
            pRVar128 = (RTCIntersectArguments *)((long)&pRVar128->flags + 1);
          }
        }
        auVar168._8_4_ = 0x3f800000;
        auVar168._0_8_ = 0x3f8000003f800000;
        auVar168._12_4_ = 0x3f800000;
        auVar168._16_4_ = 0x3f800000;
        auVar168._20_4_ = 0x3f800000;
        auVar168._24_4_ = 0x3f800000;
        auVar168._28_4_ = 0x3f800000;
        auVar147 = vsubps_avx(auVar168,auVar162);
        uVar135 = local_2c00._0_4_;
        uVar87 = local_2c00._4_4_;
        uVar89 = local_2c00._8_4_;
        uVar91 = local_2c00._12_4_;
        uVar93 = local_2c00._16_4_;
        uVar95 = local_2c00._20_4_;
        uVar97 = local_2c00._24_4_;
        uVar99 = local_2c00._28_4_;
        uVar101 = local_2c00._64_4_;
        uVar103 = local_2c00._68_4_;
        uVar106 = local_2c00._72_4_;
        uVar109 = local_2c00._76_4_;
        uVar112 = local_2c00._80_4_;
        uVar115 = local_2c00._84_4_;
        uVar118 = local_2c00._88_4_;
        uVar121 = local_2c00._92_4_;
        fVar187 = auVar147._0_4_;
        fVar188 = auVar147._4_4_;
        fVar189 = auVar147._8_4_;
        fVar190 = auVar147._12_4_;
        fVar191 = auVar147._16_4_;
        fVar192 = auVar147._20_4_;
        fVar193 = auVar147._24_4_;
        auVar274 = ZEXT3264(CONCAT428(auVar186._28_4_ + 1.0,
                                      CONCAT424(fVar193 * (float)local_2c00._56_4_ +
                                                fVar161 * fStack_2d08,
                                                CONCAT420(fVar192 * (float)local_2c00._52_4_ +
                                                          fVar160 * fStack_2d0c,
                                                          CONCAT416(fVar191 * (float)local_2c00.
                                                                                     _48_4_ +
                                                                    fVar159 * fStack_2d10,
                                                                    CONCAT412(fVar190 * (float)
                                                  local_2c00._44_4_ + fVar157 * local_2d20[3],
                                                  CONCAT48(fVar189 * (float)local_2c00._40_4_ +
                                                           fVar155 * local_2d20[2],
                                                           CONCAT44(fVar188 * (float)local_2c00.
                                                                                     _36_4_ +
                                                                    fVar153 * local_2d20[1],
                                                                    fVar187 * (float)local_2c00.
                                                                                     _32_4_ +
                                                                    fVar138 * local_2d20[0]))))))));
        fVar203 = fVar138 * local_2d00[0];
        fVar204 = fVar153 * local_2d00[1];
        fVar205 = fVar155 * local_2d00[2];
        fVar206 = fVar157 * local_2d00[3];
        fVar207 = fVar159 * fStack_2cf0;
        fVar208 = fVar160 * fStack_2cec;
        fVar221 = fVar161 * fStack_2ce8;
        uVar127 = local_2e48;
        pRVar128 = local_2e50;
        while (fVar85 = fStack_2d24, fVar293 = fStack_2d28, fVar292 = fStack_2d2c,
              fVar291 = fStack_2d30, fVar290 = local_2d40[3], fVar289 = local_2d40[2],
              fVar288 = local_2d40[1], fVar286 = local_2d40[0], uVar127 != 0) {
          lVar130 = (long)*(int *)((long)&local_2e80.valid + (long)pRVar128 * 4) * 0x38;
          uVar132 = (ulong)*(uint *)(lVar129 + 0x10 + lVar134 * 4);
          auVar175 = *(undefined1 (*) [16])
                      (*(long *)(*(long *)(local_2ca0._0_8_ + 0xe0) + lVar130) + uVar132 * 4);
          auVar242 = ZEXT1664(auVar175);
          auVar140 = *(undefined1 (*) [16])
                      (*(long *)(*(long *)(local_2ca0._0_8_ + 0xe0) + 0x38 + lVar130) + uVar132 * 4)
          ;
          *(int *)((long)&local_2c00 + (long)pRVar128 * 4) = auVar175._0_4_;
          uVar7 = vextractps_avx(auVar175,1);
          *(undefined4 *)((long)&local_2c00 + (long)pRVar128 * 4 + 0x20) = uVar7;
          uVar7 = vextractps_avx(auVar175,2);
          *(undefined4 *)((long)&local_2c00 + (long)pRVar128 * 4 + 0x40) = uVar7;
          local_2d40[(long)pRVar128] = auVar140._0_4_;
          fVar286 = (float)vextractps_avx(auVar140,1);
          local_2d20[(long)pRVar128] = fVar286;
          fVar286 = (float)vextractps_avx(auVar140,2);
          local_2d00[(long)pRVar128] = fVar286;
          uVar132 = (ulong)pRVar128 & 0x3f;
          pRVar128 = (RTCIntersectArguments *)0x0;
          uVar127 = uVar127 ^ 1L << uVar132;
          for (uVar132 = uVar127; (uVar132 & 1) == 0; uVar132 = uVar132 >> 1 | 0x8000000000000000) {
            pRVar128 = (RTCIntersectArguments *)((long)&pRVar128->flags + 1);
          }
        }
        auVar275 = ZEXT3264(CONCAT428((float)uVar99 + fVar174,
                                      CONCAT424(fVar193 * (float)uVar97 + fVar161 * fVar245,
                                                CONCAT420(fVar192 * (float)uVar95 +
                                                          fVar160 * fVar244,
                                                          CONCAT416(fVar191 * (float)uVar93 +
                                                                    fVar159 * fVar243,
                                                                    CONCAT412(fVar190 * (float)
                                                  uVar91 + fVar157 * fVar158,
                                                  CONCAT48(fVar189 * (float)uVar89 +
                                                           fVar155 * fVar156,
                                                           CONCAT44(fVar188 * (float)uVar87 +
                                                                    fVar153 * fVar154,
                                                                    fVar187 * (float)uVar135 +
                                                                    fVar138 * fVar139))))))));
        uVar135 = local_2c00._0_4_;
        uVar87 = local_2c00._4_4_;
        uVar89 = local_2c00._8_4_;
        uVar91 = local_2c00._12_4_;
        uVar93 = local_2c00._16_4_;
        uVar95 = local_2c00._20_4_;
        uVar97 = local_2c00._24_4_;
        uVar99 = local_2c00._28_4_;
        uVar7 = local_2c00._64_4_;
        uVar104 = local_2c00._68_4_;
        uVar107 = local_2c00._72_4_;
        uVar110 = local_2c00._76_4_;
        uVar113 = local_2c00._80_4_;
        uVar116 = local_2c00._84_4_;
        uVar119 = local_2c00._88_4_;
        uVar122 = local_2c00._92_4_;
        fVar154 = fVar187 * (float)local_2c00._32_4_;
        fVar158 = fVar188 * (float)local_2c00._36_4_;
        fVar244 = fVar189 * (float)local_2c00._40_4_;
        fVar174 = fVar190 * (float)local_2c00._44_4_;
        fVar247 = fVar191 * (float)local_2c00._48_4_;
        fVar249 = fVar192 * (float)local_2c00._52_4_;
        fVar251 = fVar193 * (float)local_2c00._56_4_;
        fVar263 = fVar138 * local_2d20[0];
        fVar266 = fVar153 * local_2d20[1];
        fVar267 = fVar155 * local_2d20[2];
        fVar268 = fVar157 * local_2d20[3];
        fVar269 = fVar159 * fStack_2d10;
        fVar270 = fVar160 * fStack_2d0c;
        fVar271 = fVar161 * fStack_2d08;
        fVar139 = auVar242._28_4_;
        fVar156 = fVar138 * local_2d00[0];
        fVar243 = fVar153 * local_2d00[1];
        fVar245 = fVar155 * local_2d00[2];
        fVar246 = fVar157 * local_2d00[3];
        fVar248 = fVar159 * fStack_2cf0;
        fVar250 = fVar160 * fStack_2cec;
        fVar252 = fVar161 * fStack_2ce8;
        uVar127 = local_2e48;
        pRVar128 = local_2e50;
        while (fVar84 = fStack_2d28, fVar83 = fStack_2d2c, fVar82 = fStack_2d30,
              fVar81 = local_2d40[3], fVar74 = local_2d40[2], fVar73 = local_2d40[1],
              fVar72 = local_2d40[0], uVar127 != 0) {
          lVar130 = (long)*(int *)((long)&local_2e80.valid + (long)pRVar128 * 4) * 0x38;
          uVar132 = (ulong)*(uint *)(lVar129 + 0x20 + lVar134 * 4);
          auVar175 = *(undefined1 (*) [16])
                      (*(long *)(*(long *)(local_2ca0._0_8_ + 0xe0) + lVar130) + uVar132 * 4);
          pfVar2 = (float *)(*(long *)(*(long *)(local_2ca0._0_8_ + 0xe0) + 0x38 + lVar130) +
                            uVar132 * 4);
          fVar72 = *pfVar2;
          fVar73 = pfVar2[1];
          fVar74 = pfVar2[2];
          *(int *)((long)&local_2c00 + (long)pRVar128 * 4) = auVar175._0_4_;
          uVar8 = vextractps_avx(auVar175,1);
          *(undefined4 *)((long)&local_2c00 + (long)pRVar128 * 4 + 0x20) = uVar8;
          uVar8 = vextractps_avx(auVar175,2);
          *(undefined4 *)((long)&local_2c00 + (long)pRVar128 * 4 + 0x40) = uVar8;
          local_2d40[(long)pRVar128] = fVar72;
          local_2d20[(long)pRVar128] = fVar73;
          local_2d00[(long)pRVar128] = fVar74;
          uVar132 = (ulong)pRVar128 & 0x3f;
          pRVar128 = (RTCIntersectArguments *)0x0;
          uVar127 = uVar127 ^ 1L << uVar132;
          for (uVar132 = uVar127; (uVar132 & 1) == 0; uVar132 = uVar132 >> 1 | 0x8000000000000000) {
            pRVar128 = (RTCIntersectArguments *)((long)&pRVar128->flags + 1);
          }
        }
        uVar8 = local_2c00._0_4_;
        uVar88 = local_2c00._4_4_;
        uVar90 = local_2c00._8_4_;
        uVar92 = local_2c00._12_4_;
        uVar94 = local_2c00._16_4_;
        uVar96 = local_2c00._20_4_;
        uVar98 = local_2c00._24_4_;
        uVar100 = local_2c00._28_4_;
        uVar102 = local_2c00._64_4_;
        uVar105 = local_2c00._68_4_;
        uVar108 = local_2c00._72_4_;
        uVar111 = local_2c00._76_4_;
        uVar114 = local_2c00._80_4_;
        uVar117 = local_2c00._84_4_;
        uVar120 = local_2c00._88_4_;
        uVar123 = local_2c00._92_4_;
        local_2960._4_4_ = fVar188 * (float)local_2c00._36_4_ + fVar153 * local_2d20[1];
        local_2960._0_4_ = fVar187 * (float)local_2c00._32_4_ + fVar138 * local_2d20[0];
        fStack_2958 = fVar189 * (float)local_2c00._40_4_ + fVar155 * local_2d20[2];
        fStack_2954 = fVar190 * (float)local_2c00._44_4_ + fVar157 * local_2d20[3];
        fStack_2950 = fVar191 * (float)local_2c00._48_4_ + fVar159 * fStack_2d10;
        fStack_294c = fVar192 * (float)local_2c00._52_4_ + fVar160 * fStack_2d0c;
        fStack_2948 = fVar193 * (float)local_2c00._56_4_ + fVar161 * fStack_2d08;
        fStack_2944 = in_ZMM13._28_4_ + in_ZMM12._28_4_;
        fVar278 = fVar138 * local_2d00[0];
        fVar280 = fVar153 * local_2d00[1];
        fVar281 = fVar155 * local_2d00[2];
        fVar282 = fVar157 * local_2d00[3];
        fVar283 = fVar159 * fStack_2cf0;
        fVar284 = fVar160 * fStack_2cec;
        fVar285 = fVar161 * fStack_2ce8;
        uVar127 = local_2e48;
        pRVar128 = local_2e50;
        while (uVar127 != 0) {
          lVar130 = (long)*(int *)((long)&local_2e80.valid + (long)pRVar128 * 4) * 0x38;
          uVar132 = (ulong)*(uint *)(lVar129 + 0x30 + lVar134 * 4);
          auVar175 = *(undefined1 (*) [16])
                      (*(long *)(*(long *)(local_2ca0._0_8_ + 0xe0) + lVar130) + uVar132 * 4);
          auVar140 = *(undefined1 (*) [16])
                      (*(long *)(*(long *)(local_2ca0._0_8_ + 0xe0) + 0x38 + lVar130) + uVar132 * 4)
          ;
          *(int *)((long)&local_2c00 + (long)pRVar128 * 4) = auVar175._0_4_;
          uVar9 = vextractps_avx(auVar175,1);
          *(undefined4 *)((long)&local_2c00 + (long)pRVar128 * 4 + 0x20) = uVar9;
          uVar9 = vextractps_avx(auVar175,2);
          *(undefined4 *)((long)&local_2c00 + (long)pRVar128 * 4 + 0x40) = uVar9;
          local_2d40[(long)pRVar128] = auVar140._0_4_;
          fVar10 = (float)vextractps_avx(auVar140,1);
          local_2d20[(long)pRVar128] = fVar10;
          fVar10 = (float)vextractps_avx(auVar140,2);
          local_2d00[(long)pRVar128] = fVar10;
          uVar132 = (ulong)pRVar128 & 0x3f;
          pRVar128 = (RTCIntersectArguments *)0x0;
          uVar127 = uVar127 ^ 1L << uVar132;
          for (uVar132 = uVar127; (uVar132 & 1) == 0; uVar132 = uVar132 >> 1 | 0x8000000000000000) {
            pRVar128 = (RTCIntersectArguments *)((long)&pRVar128->flags + 1);
          }
        }
        auVar220._0_4_ = fVar187 * (float)uVar101 + fVar203;
        auVar220._4_4_ = fVar188 * (float)uVar103 + fVar204;
        auVar220._8_4_ = fVar189 * (float)uVar106 + fVar205;
        auVar220._12_4_ = fVar190 * (float)uVar109 + fVar206;
        auVar220._16_4_ = fVar191 * (float)uVar112 + fVar207;
        auVar220._20_4_ = fVar192 * (float)uVar115 + fVar208;
        auVar220._24_4_ = fVar193 * (float)uVar118 + fVar221;
        auVar220._28_4_ = (float)uVar121 + auVar186._28_4_;
        local_2e40._4_4_ = fVar188 * (float)uVar104 + fVar243;
        local_2e40._0_4_ = fVar187 * (float)uVar7 + fVar156;
        auStack_2e38._0_4_ = fVar189 * (float)uVar107 + fVar245;
        auStack_2e38._4_4_ = fVar190 * (float)uVar110 + fVar246;
        fStack_2e30 = fVar191 * (float)uVar113 + fVar248;
        fStack_2e2c = fVar192 * (float)uVar116 + fVar250;
        fStack_2e28 = fVar193 * (float)uVar119 + fVar252;
        fStack_2e24 = (float)uVar122 + fVar139;
        fStack_2964 = in_ZMM14._28_4_ + (float)uVar121;
        local_2980._4_4_ = fVar280 + (float)uVar105 * fVar188;
        local_2980._0_4_ = fVar278 + (float)uVar102 * fVar187;
        fStack_2978 = fVar281 + (float)uVar108 * fVar189;
        fStack_2974 = fVar282 + (float)uVar111 * fVar190;
        fStack_2970 = fVar283 + (float)uVar114 * fVar191;
        fStack_296c = fVar284 + (float)uVar117 * fVar192;
        fStack_2968 = fVar285 + (float)uVar120 * fVar193;
        fStack_2984 = (float)uVar122 + fVar139 + fStack_2964;
        local_29a0._4_4_ = (float)uVar88 * fVar188 + fVar73 * fVar153;
        local_29a0._0_4_ = (float)uVar8 * fVar187 + fVar72 * fVar138;
        fStack_2998 = (float)uVar90 * fVar189 + fVar74 * fVar155;
        fStack_2994 = (float)uVar92 * fVar190 + fVar81 * fVar157;
        fStack_2990 = (float)uVar94 * fVar191 + fVar82 * fVar159;
        fStack_298c = (float)uVar96 * fVar192 + fVar83 * fVar160;
        fStack_2988 = (float)uVar98 * fVar193 + fVar84 * fVar161;
        local_2640._0_4_ = fVar138 * local_2d40[0] + fVar187 * (float)local_2c00._0_4_;
        local_2640._4_4_ = fVar153 * local_2d40[1] + fVar188 * (float)local_2c00._4_4_;
        local_2640._8_4_ = fVar155 * local_2d40[2] + fVar189 * (float)local_2c00._8_4_;
        local_2640._12_4_ = fVar157 * local_2d40[3] + fVar190 * (float)local_2c00._12_4_;
        local_2640._16_4_ = fVar159 * fStack_2d30 + fVar191 * (float)local_2c00._16_4_;
        local_2640._20_4_ = fVar160 * fStack_2d2c + fVar192 * (float)local_2c00._20_4_;
        local_2640._24_4_ = fVar161 * fStack_2d28 + fVar193 * (float)local_2c00._24_4_;
        local_2640._28_4_ = (float)uVar123 + fVar139;
        local_2660._0_4_ = fVar187 * (float)local_2c00._32_4_ + fVar138 * local_2d20[0];
        local_2660._4_4_ = fVar188 * (float)local_2c00._36_4_ + fVar153 * local_2d20[1];
        local_2660._8_4_ = fVar189 * (float)local_2c00._40_4_ + fVar155 * local_2d20[2];
        local_2660._12_4_ = fVar190 * (float)local_2c00._44_4_ + fVar157 * local_2d20[3];
        local_2660._16_4_ = fVar191 * (float)local_2c00._48_4_ + fVar159 * fStack_2d10;
        local_2660._20_4_ = fVar192 * (float)local_2c00._52_4_ + fVar160 * fStack_2d0c;
        local_2660._24_4_ = fVar193 * (float)local_2c00._56_4_ + fVar161 * fStack_2d08;
        local_2660._28_4_ = (float)uVar100 + fStack_2984;
        local_2680._0_4_ = fVar187 * (float)local_2c00._64_4_ + fVar138 * local_2d00[0];
        local_2680._4_4_ = fVar188 * (float)local_2c00._68_4_ + fVar153 * local_2d00[1];
        local_2680._8_4_ = fVar189 * (float)local_2c00._72_4_ + fVar155 * local_2d00[2];
        local_2680._12_4_ = fVar190 * (float)local_2c00._76_4_ + fVar157 * local_2d00[3];
        local_2680._16_4_ = fVar191 * (float)local_2c00._80_4_ + fVar159 * fStack_2cf0;
        local_2680._20_4_ = fVar192 * (float)local_2c00._84_4_ + fVar160 * fStack_2cec;
        local_2680._24_4_ = fVar193 * (float)local_2c00._88_4_ + fVar161 * fStack_2ce8;
        local_2680._28_4_ = auVar147._28_4_ + auVar162._28_4_;
        local_2da0._4_4_ = fVar266 + fVar158;
        local_2da0._0_4_ = fVar263 + fVar154;
        fStack_2d98 = fVar267 + fVar244;
        fStack_2d94 = fVar268 + fVar174;
        fStack_2d90 = fVar269 + fVar247;
        fStack_2d8c = fVar270 + fVar249;
        fStack_2d88 = fVar271 + fVar251;
        fStack_2d84 = auVar265._28_4_ + fVar139;
        local_2cc0._4_4_ = (float)uVar87 * fVar188 + fVar288 * fVar153;
        local_2cc0._0_4_ = (float)uVar135 * fVar187 + fVar286 * fVar138;
        fStack_2cb8 = (float)uVar89 * fVar189 + fVar289 * fVar155;
        fStack_2cb4 = (float)uVar91 * fVar190 + fVar290 * fVar157;
        fStack_2cb0 = (float)uVar93 * fVar191 + fVar291 * fVar159;
        fStack_2cac = (float)uVar95 * fVar192 + fVar292 * fVar160;
        fStack_2ca8 = (float)uVar97 * fVar193 + fVar293 * fVar161;
        fStack_2ca4 = (float)uVar99 + fVar85;
        pRVar128 = (RTCIntersectArguments *)0x0;
      }
      auVar147 = *(undefined1 (*) [32])ray;
      auVar162 = *(undefined1 (*) [32])(ray + 0x20);
      auVar194 = *(undefined1 (*) [32])(ray + 0x40);
      local_2dc0 = vsubps_avx(auVar275._0_32_,auVar147);
      local_2de0 = vsubps_avx(auVar274._0_32_,auVar162);
      local_2ce0 = vsubps_avx(auVar220,auVar194);
      auVar146 = vsubps_avx(local_2640,auVar147);
      auVar228 = vsubps_avx(local_2660,auVar162);
      auVar259 = vsubps_avx(local_2680,auVar194);
      local_2a20 = vsubps_avx(auVar146,local_2dc0);
      local_2a60 = vsubps_avx(auVar228,local_2de0);
      local_2a40 = vsubps_avx(auVar259,local_2ce0);
      auVar198._0_4_ = auVar146._0_4_ + local_2dc0._0_4_;
      auVar198._4_4_ = auVar146._4_4_ + local_2dc0._4_4_;
      auVar198._8_4_ = auVar146._8_4_ + local_2dc0._8_4_;
      auVar198._12_4_ = auVar146._12_4_ + local_2dc0._12_4_;
      auVar198._16_4_ = auVar146._16_4_ + local_2dc0._16_4_;
      auVar198._20_4_ = auVar146._20_4_ + local_2dc0._20_4_;
      auVar198._24_4_ = auVar146._24_4_ + local_2dc0._24_4_;
      auVar198._28_4_ = auVar146._28_4_ + local_2dc0._28_4_;
      auVar215._0_4_ = auVar228._0_4_ + local_2de0._0_4_;
      auVar215._4_4_ = auVar228._4_4_ + local_2de0._4_4_;
      auVar215._8_4_ = auVar228._8_4_ + local_2de0._8_4_;
      auVar215._12_4_ = auVar228._12_4_ + local_2de0._12_4_;
      auVar215._16_4_ = auVar228._16_4_ + local_2de0._16_4_;
      auVar215._20_4_ = auVar228._20_4_ + local_2de0._20_4_;
      auVar215._24_4_ = auVar228._24_4_ + local_2de0._24_4_;
      fVar139 = local_2de0._28_4_;
      auVar215._28_4_ = auVar228._28_4_ + fVar139;
      fVar138 = local_2ce0._0_4_;
      auVar262._0_4_ = auVar259._0_4_ + fVar138;
      fVar153 = local_2ce0._4_4_;
      auVar262._4_4_ = auVar259._4_4_ + fVar153;
      fVar155 = local_2ce0._8_4_;
      auVar262._8_4_ = auVar259._8_4_ + fVar155;
      fVar157 = local_2ce0._12_4_;
      auVar262._12_4_ = auVar259._12_4_ + fVar157;
      fVar159 = local_2ce0._16_4_;
      auVar262._16_4_ = auVar259._16_4_ + fVar159;
      fVar160 = local_2ce0._20_4_;
      auVar262._20_4_ = auVar259._20_4_ + fVar160;
      fVar161 = local_2ce0._24_4_;
      fVar174 = auVar259._28_4_;
      auVar262._24_4_ = auVar259._24_4_ + fVar161;
      auVar262._28_4_ = fVar174 + local_2ce0._28_4_;
      auVar242._0_4_ = auVar215._0_4_ * local_2a40._0_4_;
      auVar242._4_4_ = auVar215._4_4_ * local_2a40._4_4_;
      auVar242._8_4_ = auVar215._8_4_ * local_2a40._8_4_;
      auVar242._12_4_ = auVar215._12_4_ * local_2a40._12_4_;
      auVar242._16_4_ = auVar215._16_4_ * local_2a40._16_4_;
      auVar242._20_4_ = auVar215._20_4_ * local_2a40._20_4_;
      auVar242._28_36_ = auVar274._28_36_;
      auVar242._24_4_ = auVar215._24_4_ * local_2a40._24_4_;
      auVar140 = vfmsub231ps_fma(auVar242._0_32_,local_2a60,auVar262);
      auVar186._0_4_ = auVar262._0_4_ * local_2a20._0_4_;
      auVar186._4_4_ = auVar262._4_4_ * local_2a20._4_4_;
      auVar186._8_4_ = auVar262._8_4_ * local_2a20._8_4_;
      auVar186._12_4_ = auVar262._12_4_ * local_2a20._12_4_;
      auVar186._16_4_ = auVar262._16_4_ * local_2a20._16_4_;
      auVar186._20_4_ = auVar262._20_4_ * local_2a20._20_4_;
      auVar186._28_36_ = auVar275._28_36_;
      auVar186._24_4_ = auVar262._24_4_ * local_2a20._24_4_;
      auVar175 = vfmsub231ps_fma(auVar186._0_32_,local_2a40,auVar198);
      auVar32._4_4_ = auVar198._4_4_ * local_2a60._4_4_;
      auVar32._0_4_ = auVar198._0_4_ * local_2a60._0_4_;
      auVar32._8_4_ = auVar198._8_4_ * local_2a60._8_4_;
      auVar32._12_4_ = auVar198._12_4_ * local_2a60._12_4_;
      auVar32._16_4_ = auVar198._16_4_ * local_2a60._16_4_;
      auVar32._20_4_ = auVar198._20_4_ * local_2a60._20_4_;
      auVar32._24_4_ = auVar198._24_4_ * local_2a60._24_4_;
      auVar32._28_4_ = local_2a60._28_4_;
      auVar17 = vfmsub231ps_fma(auVar32,local_2a20,auVar215);
      pRVar1 = ray + 0xc0;
      fVar187 = *(float *)pRVar1;
      fVar188 = *(float *)(ray + 0xc4);
      fVar189 = *(float *)(ray + 200);
      fVar190 = *(float *)(ray + 0xcc);
      fVar191 = *(float *)(ray + 0xd0);
      fVar192 = *(float *)(ray + 0xd4);
      fVar193 = *(float *)(ray + 0xd8);
      auVar80 = *(undefined1 (*) [28])pRVar1;
      auVar33._4_4_ = fVar188 * auVar17._4_4_;
      auVar33._0_4_ = fVar187 * auVar17._0_4_;
      auVar33._8_4_ = fVar189 * auVar17._8_4_;
      auVar33._12_4_ = fVar190 * auVar17._12_4_;
      auVar33._16_4_ = fVar191 * 0.0;
      auVar33._20_4_ = fVar192 * 0.0;
      auVar33._24_4_ = fVar193 * 0.0;
      auVar33._28_4_ = local_2a20._28_4_;
      auVar195 = *(undefined1 (*) [32])(ray + 0xa0);
      auVar175 = vfmadd231ps_fma(auVar33,auVar195,ZEXT1632(auVar175));
      local_2aa0 = *(undefined1 (*) [32])(ray + 0x80);
      auVar175 = vfmadd231ps_fma(ZEXT1632(auVar175),local_2aa0,ZEXT1632(auVar140));
      auVar242 = ZEXT1664(auVar175);
      auVar147 = vsubps_avx(_local_2cc0,auVar147);
      auVar162 = vsubps_avx(_local_2da0,auVar162);
      auVar194 = vsubps_avx(_local_2e40,auVar194);
      auVar260 = vsubps_avx(local_2de0,auVar162);
      in_ZMM13 = ZEXT3264(auVar260);
      auVar273 = vsubps_avx(local_2ce0,auVar194);
      in_ZMM15 = ZEXT3264(auVar273);
      auVar216._0_4_ = local_2de0._0_4_ + auVar162._0_4_;
      auVar216._4_4_ = local_2de0._4_4_ + auVar162._4_4_;
      auVar216._8_4_ = local_2de0._8_4_ + auVar162._8_4_;
      auVar216._12_4_ = local_2de0._12_4_ + auVar162._12_4_;
      auVar216._16_4_ = local_2de0._16_4_ + auVar162._16_4_;
      auVar216._20_4_ = local_2de0._20_4_ + auVar162._20_4_;
      auVar216._24_4_ = local_2de0._24_4_ + auVar162._24_4_;
      auVar216._28_4_ = fVar139 + auVar162._28_4_;
      auVar276._0_4_ = fVar138 + auVar194._0_4_;
      auVar276._4_4_ = fVar153 + auVar194._4_4_;
      auVar276._8_4_ = fVar155 + auVar194._8_4_;
      auVar276._12_4_ = fVar157 + auVar194._12_4_;
      auVar276._16_4_ = fVar159 + auVar194._16_4_;
      auVar276._20_4_ = fVar160 + auVar194._20_4_;
      auVar276._24_4_ = fVar161 + auVar194._24_4_;
      auVar276._28_4_ = local_2ce0._28_4_ + auVar194._28_4_;
      fVar286 = auVar273._0_4_;
      fVar288 = auVar273._4_4_;
      auVar34._4_4_ = fVar288 * auVar216._4_4_;
      auVar34._0_4_ = fVar286 * auVar216._0_4_;
      fVar289 = auVar273._8_4_;
      auVar34._8_4_ = fVar289 * auVar216._8_4_;
      fVar290 = auVar273._12_4_;
      auVar34._12_4_ = fVar290 * auVar216._12_4_;
      fVar291 = auVar273._16_4_;
      auVar34._16_4_ = fVar291 * auVar216._16_4_;
      fVar292 = auVar273._20_4_;
      auVar34._20_4_ = fVar292 * auVar216._20_4_;
      fVar293 = auVar273._24_4_;
      auVar34._24_4_ = fVar293 * auVar216._24_4_;
      auVar34._28_4_ = fVar139;
      auVar17 = vfmsub231ps_fma(auVar34,auVar260,auVar276);
      auVar185 = vsubps_avx(local_2dc0,auVar147);
      in_ZMM14 = ZEXT3264(auVar185);
      fVar139 = auVar185._0_4_;
      fVar154 = auVar185._4_4_;
      auVar35._4_4_ = auVar276._4_4_ * fVar154;
      auVar35._0_4_ = auVar276._0_4_ * fVar139;
      fVar156 = auVar185._8_4_;
      auVar35._8_4_ = auVar276._8_4_ * fVar156;
      fVar158 = auVar185._12_4_;
      auVar35._12_4_ = auVar276._12_4_ * fVar158;
      fVar243 = auVar185._16_4_;
      auVar35._16_4_ = auVar276._16_4_ * fVar243;
      fVar244 = auVar185._20_4_;
      auVar35._20_4_ = auVar276._20_4_ * fVar244;
      fVar245 = auVar185._24_4_;
      auVar35._24_4_ = auVar276._24_4_ * fVar245;
      auVar35._28_4_ = auVar276._28_4_;
      auVar235._0_4_ = local_2dc0._0_4_ + auVar147._0_4_;
      auVar235._4_4_ = local_2dc0._4_4_ + auVar147._4_4_;
      auVar235._8_4_ = local_2dc0._8_4_ + auVar147._8_4_;
      auVar235._12_4_ = local_2dc0._12_4_ + auVar147._12_4_;
      auVar235._16_4_ = local_2dc0._16_4_ + auVar147._16_4_;
      auVar235._20_4_ = local_2dc0._20_4_ + auVar147._20_4_;
      auVar235._24_4_ = local_2dc0._24_4_ + auVar147._24_4_;
      auVar235._28_4_ = local_2dc0._28_4_ + auVar147._28_4_;
      auVar140 = vfmsub231ps_fma(auVar35,auVar273,auVar235);
      fVar203 = auVar260._0_4_;
      fVar204 = auVar260._4_4_;
      auVar36._4_4_ = fVar204 * auVar235._4_4_;
      auVar36._0_4_ = fVar203 * auVar235._0_4_;
      fVar205 = auVar260._8_4_;
      auVar36._8_4_ = fVar205 * auVar235._8_4_;
      fVar206 = auVar260._12_4_;
      auVar36._12_4_ = fVar206 * auVar235._12_4_;
      fVar207 = auVar260._16_4_;
      auVar36._16_4_ = fVar207 * auVar235._16_4_;
      fVar208 = auVar260._20_4_;
      auVar36._20_4_ = fVar208 * auVar235._20_4_;
      fVar221 = auVar260._24_4_;
      auVar36._24_4_ = fVar221 * auVar235._24_4_;
      auVar36._28_4_ = auVar235._28_4_;
      auVar272 = vfmsub231ps_fma(auVar36,auVar185,auVar216);
      auVar37._4_4_ = fVar188 * auVar272._4_4_;
      auVar37._0_4_ = fVar187 * auVar272._0_4_;
      auVar37._8_4_ = fVar189 * auVar272._8_4_;
      auVar37._12_4_ = fVar190 * auVar272._12_4_;
      auVar37._16_4_ = fVar191 * 0.0;
      auVar37._20_4_ = fVar192 * 0.0;
      auVar37._24_4_ = fVar193 * 0.0;
      auVar37._28_4_ = auVar216._28_4_;
      auVar140 = vfmadd231ps_fma(auVar37,auVar195,ZEXT1632(auVar140));
      auVar140 = vfmadd231ps_fma(ZEXT1632(auVar140),local_2aa0,ZEXT1632(auVar17));
      auVar16 = vsubps_avx(auVar147,auVar146);
      in_ZMM12 = ZEXT3264(auVar16);
      auVar144._0_4_ = auVar146._0_4_ + auVar147._0_4_;
      auVar144._4_4_ = auVar146._4_4_ + auVar147._4_4_;
      auVar144._8_4_ = auVar146._8_4_ + auVar147._8_4_;
      auVar144._12_4_ = auVar146._12_4_ + auVar147._12_4_;
      auVar144._16_4_ = auVar146._16_4_ + auVar147._16_4_;
      auVar144._20_4_ = auVar146._20_4_ + auVar147._20_4_;
      auVar144._24_4_ = auVar146._24_4_ + auVar147._24_4_;
      auVar144._28_4_ = auVar146._28_4_ + auVar147._28_4_;
      auVar146 = vsubps_avx(auVar162,auVar228);
      auVar165._0_4_ = auVar228._0_4_ + auVar162._0_4_;
      auVar165._4_4_ = auVar228._4_4_ + auVar162._4_4_;
      auVar165._8_4_ = auVar228._8_4_ + auVar162._8_4_;
      auVar165._12_4_ = auVar228._12_4_ + auVar162._12_4_;
      auVar165._16_4_ = auVar228._16_4_ + auVar162._16_4_;
      auVar165._20_4_ = auVar228._20_4_ + auVar162._20_4_;
      auVar165._24_4_ = auVar228._24_4_ + auVar162._24_4_;
      auVar165._28_4_ = auVar228._28_4_ + auVar162._28_4_;
      auVar228 = vsubps_avx(auVar194,auVar259);
      auVar181._0_4_ = auVar194._0_4_ + auVar259._0_4_;
      auVar181._4_4_ = auVar194._4_4_ + auVar259._4_4_;
      auVar181._8_4_ = auVar194._8_4_ + auVar259._8_4_;
      auVar181._12_4_ = auVar194._12_4_ + auVar259._12_4_;
      auVar181._16_4_ = auVar194._16_4_ + auVar259._16_4_;
      auVar181._20_4_ = auVar194._20_4_ + auVar259._20_4_;
      auVar181._24_4_ = auVar194._24_4_ + auVar259._24_4_;
      auVar181._28_4_ = auVar194._28_4_ + fVar174;
      auVar38._4_4_ = auVar228._4_4_ * auVar165._4_4_;
      auVar38._0_4_ = auVar228._0_4_ * auVar165._0_4_;
      auVar38._8_4_ = auVar228._8_4_ * auVar165._8_4_;
      auVar38._12_4_ = auVar228._12_4_ * auVar165._12_4_;
      auVar38._16_4_ = auVar228._16_4_ * auVar165._16_4_;
      auVar38._20_4_ = auVar228._20_4_ * auVar165._20_4_;
      auVar38._24_4_ = auVar228._24_4_ * auVar165._24_4_;
      auVar38._28_4_ = fVar174;
      auVar272 = vfmsub231ps_fma(auVar38,auVar146,auVar181);
      auVar39._4_4_ = auVar16._4_4_ * auVar181._4_4_;
      auVar39._0_4_ = auVar16._0_4_ * auVar181._0_4_;
      auVar39._8_4_ = auVar16._8_4_ * auVar181._8_4_;
      auVar39._12_4_ = auVar16._12_4_ * auVar181._12_4_;
      auVar39._16_4_ = auVar16._16_4_ * auVar181._16_4_;
      auVar39._20_4_ = auVar16._20_4_ * auVar181._20_4_;
      auVar39._24_4_ = auVar16._24_4_ * auVar181._24_4_;
      auVar39._28_4_ = auVar181._28_4_;
      auVar17 = vfmsub231ps_fma(auVar39,auVar228,auVar144);
      auVar40._4_4_ = auVar146._4_4_ * auVar144._4_4_;
      auVar40._0_4_ = auVar146._0_4_ * auVar144._0_4_;
      auVar40._8_4_ = auVar146._8_4_ * auVar144._8_4_;
      auVar40._12_4_ = auVar146._12_4_ * auVar144._12_4_;
      auVar40._16_4_ = auVar146._16_4_ * auVar144._16_4_;
      auVar40._20_4_ = auVar146._20_4_ * auVar144._20_4_;
      auVar40._24_4_ = auVar146._24_4_ * auVar144._24_4_;
      auVar40._28_4_ = auVar144._28_4_;
      auVar18 = vfmsub231ps_fma(auVar40,auVar16,auVar165);
      _local_2a80 = *(undefined1 (*) [32])pRVar1;
      auVar145._0_4_ = fVar187 * auVar18._0_4_;
      auVar145._4_4_ = fVar188 * auVar18._4_4_;
      auVar145._8_4_ = fVar189 * auVar18._8_4_;
      auVar145._12_4_ = fVar190 * auVar18._12_4_;
      auVar145._16_4_ = fVar191 * 0.0;
      auVar145._20_4_ = fVar192 * 0.0;
      auVar145._24_4_ = fVar193 * 0.0;
      auVar145._28_4_ = 0;
      auVar17 = vfmadd231ps_fma(auVar145,auVar195,ZEXT1632(auVar17));
      auVar17 = vfmadd231ps_fma(ZEXT1632(auVar17),local_2aa0,ZEXT1632(auVar272));
      auVar141 = ZEXT1632(CONCAT412(auVar17._12_4_ + auVar175._12_4_ + auVar140._12_4_,
                                    CONCAT48(auVar17._8_4_ + auVar175._8_4_ + auVar140._8_4_,
                                             CONCAT44(auVar17._4_4_ +
                                                      auVar175._4_4_ + auVar140._4_4_,
                                                      auVar17._0_4_ +
                                                      auVar175._0_4_ + auVar140._0_4_))));
      local_26a0 = ZEXT1632(auVar175);
      auVar147 = vminps_avx(local_26a0,ZEXT1632(auVar140));
      auVar147 = vminps_avx(auVar147,ZEXT1632(auVar17));
      local_26c0 = vandps_avx(auVar141,local_2940);
      auVar272._8_4_ = 0x80000000;
      auVar272._0_8_ = 0x8000000080000000;
      auVar272._12_4_ = 0x80000000;
      local_2d80._16_4_ = 0x80000000;
      local_2d80._0_16_ = auVar272;
      local_2d80._20_4_ = 0x80000000;
      local_2d80._24_4_ = 0x80000000;
      local_2d80._28_4_ = 0x80000000;
      fVar174 = local_26c0._0_4_ * 1.1920929e-07;
      fVar187 = local_26c0._4_4_ * 1.1920929e-07;
      auVar41._4_4_ = fVar187;
      auVar41._0_4_ = fVar174;
      fVar188 = local_26c0._8_4_ * 1.1920929e-07;
      auVar41._8_4_ = fVar188;
      fVar189 = local_26c0._12_4_ * 1.1920929e-07;
      auVar41._12_4_ = fVar189;
      fVar190 = local_26c0._16_4_ * 1.1920929e-07;
      auVar41._16_4_ = fVar190;
      fVar191 = local_26c0._20_4_ * 1.1920929e-07;
      auVar41._20_4_ = fVar191;
      fVar192 = local_26c0._24_4_ * 1.1920929e-07;
      auVar41._24_4_ = fVar192;
      auVar41._28_4_ = 0x34000000;
      auVar199._0_8_ = CONCAT44(fVar187,fVar174) ^ 0x8000000080000000;
      auVar199._8_4_ = -fVar188;
      auVar199._12_4_ = -fVar189;
      auVar199._16_4_ = -fVar190;
      auVar199._20_4_ = -fVar191;
      auVar199._24_4_ = -fVar192;
      auVar199._28_4_ = 0xb4000000;
      auVar147 = vcmpps_avx(auVar147,auVar199,5);
      local_26e0 = ZEXT1632(auVar140);
      auVar194 = vmaxps_avx(local_26a0,ZEXT1632(auVar140));
      auVar162 = vmaxps_avx(auVar194,ZEXT1632(auVar17));
      auVar162 = vcmpps_avx(auVar162,auVar41,2);
      auVar162 = vorps_avx(auVar147,auVar162);
      auVar259 = auVar176 & auVar162;
      if ((((((((auVar259 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (auVar259 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (auVar259 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(auVar259 >> 0x7f,0) == '\0') &&
            (auVar259 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
           SUB321(auVar259 >> 0xbf,0) == '\0') &&
          (auVar259 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
          -1 < auVar259[0x1f]) {
LAB_015c990b:
        auVar274 = ZEXT3264(local_2d80);
        auVar176 = local_2e20;
      }
      else {
        local_2700 = auVar141;
        local_2ac0 = auVar162;
        auVar42._4_4_ = fVar204 * local_2a40._4_4_;
        auVar42._0_4_ = fVar203 * local_2a40._0_4_;
        auVar42._8_4_ = fVar205 * local_2a40._8_4_;
        auVar42._12_4_ = fVar206 * local_2a40._12_4_;
        auVar42._16_4_ = fVar207 * local_2a40._16_4_;
        auVar42._20_4_ = fVar208 * local_2a40._20_4_;
        auVar42._24_4_ = fVar221 * local_2a40._24_4_;
        auVar42._28_4_ = auVar162._28_4_;
        auVar43._4_4_ = fVar154 * local_2a60._4_4_;
        auVar43._0_4_ = fVar139 * local_2a60._0_4_;
        auVar43._8_4_ = fVar156 * local_2a60._8_4_;
        auVar43._12_4_ = fVar158 * local_2a60._12_4_;
        auVar43._16_4_ = fVar243 * local_2a60._16_4_;
        auVar43._20_4_ = fVar244 * local_2a60._20_4_;
        auVar43._24_4_ = fVar245 * local_2a60._24_4_;
        auVar43._28_4_ = auVar147._28_4_;
        auVar17 = vfmsub213ps_fma(local_2a60,auVar273,auVar42);
        auVar44._4_4_ = auVar146._4_4_ * fVar288;
        auVar44._0_4_ = auVar146._0_4_ * fVar286;
        auVar44._8_4_ = auVar146._8_4_ * fVar289;
        auVar44._12_4_ = auVar146._12_4_ * fVar290;
        auVar44._16_4_ = auVar146._16_4_ * fVar291;
        auVar44._20_4_ = auVar146._20_4_ * fVar292;
        auVar44._24_4_ = auVar146._24_4_ * fVar293;
        auVar44._28_4_ = 0x34000000;
        auVar45._4_4_ = fVar154 * auVar228._4_4_;
        auVar45._0_4_ = fVar139 * auVar228._0_4_;
        auVar45._8_4_ = fVar156 * auVar228._8_4_;
        auVar45._12_4_ = fVar158 * auVar228._12_4_;
        auVar45._16_4_ = fVar243 * auVar228._16_4_;
        auVar45._20_4_ = fVar244 * auVar228._20_4_;
        auVar45._24_4_ = fVar245 * auVar228._24_4_;
        auVar45._28_4_ = auVar194._28_4_;
        auVar18 = vfmsub213ps_fma(auVar228,auVar260,auVar44);
        auVar147 = vandps_avx(auVar42,local_2940);
        auVar194 = vandps_avx(auVar44,local_2940);
        auVar147 = vcmpps_avx(auVar147,auVar194,1);
        vVar14.field_0 =
             (anon_union_32_3_4e90abd3_for_vfloat_impl<8>_1)
             vblendvps_avx(ZEXT1632(auVar18),ZEXT1632(auVar17),auVar147);
        auVar46._4_4_ = auVar16._4_4_ * fVar204;
        auVar46._0_4_ = auVar16._0_4_ * fVar203;
        auVar46._8_4_ = auVar16._8_4_ * fVar205;
        auVar46._12_4_ = auVar16._12_4_ * fVar206;
        auVar46._16_4_ = auVar16._16_4_ * fVar207;
        auVar46._20_4_ = auVar16._20_4_ * fVar208;
        auVar46._24_4_ = auVar16._24_4_ * fVar221;
        auVar46._28_4_ = auVar147._28_4_;
        auVar19 = vfmsub213ps_fma(auVar16,auVar273,auVar45);
        in_ZMM12 = ZEXT1664(auVar19);
        auVar47._4_4_ = fVar288 * local_2a20._4_4_;
        auVar47._0_4_ = fVar286 * local_2a20._0_4_;
        auVar47._8_4_ = fVar289 * local_2a20._8_4_;
        auVar47._12_4_ = fVar290 * local_2a20._12_4_;
        auVar47._16_4_ = fVar291 * local_2a20._16_4_;
        auVar47._20_4_ = fVar292 * local_2a20._20_4_;
        auVar47._24_4_ = fVar293 * local_2a20._24_4_;
        auVar47._28_4_ = auVar194._28_4_;
        auVar17 = vfmsub213ps_fma(local_2a40,auVar185,auVar47);
        auVar147 = vandps_avx(auVar47,local_2940);
        auVar194 = vandps_avx(auVar45,local_2940);
        auVar147 = vcmpps_avx(auVar147,auVar194,1);
        vVar15.field_0 =
             (anon_union_32_3_4e90abd3_for_vfloat_impl<8>_1)
             vblendvps_avx(ZEXT1632(auVar19),ZEXT1632(auVar17),auVar147);
        auVar20 = vfmsub213ps_fma(local_2a20,auVar260,auVar43);
        auVar242 = ZEXT1664(auVar20);
        auVar17 = vfmsub213ps_fma(auVar146,auVar185,auVar46);
        auVar147 = vandps_avx(auVar43,local_2940);
        auVar194 = vandps_avx(auVar46,local_2940);
        auVar146 = vcmpps_avx(auVar147,auVar194,1);
        auVar194 = vblendvps_avx(ZEXT1632(auVar17),ZEXT1632(auVar20),auVar146);
        local_2a80._0_4_ = auVar80._0_4_;
        local_2a80._4_4_ = auVar80._4_4_;
        fStack_2a78 = auVar80._8_4_;
        fStack_2a74 = auVar80._12_4_;
        fStack_2a70 = auVar80._16_4_;
        fStack_2a6c = auVar80._20_4_;
        fStack_2a68 = auVar80._24_4_;
        auVar48._4_4_ = auVar194._4_4_ * (float)local_2a80._4_4_;
        auVar48._0_4_ = auVar194._0_4_ * (float)local_2a80._0_4_;
        auVar48._8_4_ = auVar194._8_4_ * fStack_2a78;
        auVar48._12_4_ = auVar194._12_4_ * fStack_2a74;
        auVar48._16_4_ = auVar194._16_4_ * fStack_2a70;
        auVar48._20_4_ = auVar194._20_4_ * fStack_2a6c;
        auVar48._24_4_ = auVar194._24_4_ * fStack_2a68;
        auVar48._28_4_ = auVar146._28_4_;
        auVar17 = vfmadd213ps_fma(auVar195,(undefined1  [32])vVar15.field_0,auVar48);
        auVar17 = vfmadd213ps_fma(local_2aa0,(undefined1  [32])vVar14.field_0,ZEXT1632(auVar17));
        fVar139 = auVar17._0_4_ + auVar17._0_4_;
        fVar154 = auVar17._4_4_ + auVar17._4_4_;
        fVar156 = auVar17._8_4_ + auVar17._8_4_;
        fVar158 = auVar17._12_4_ + auVar17._12_4_;
        auVar146 = ZEXT1632(CONCAT412(fVar158,CONCAT48(fVar156,CONCAT44(fVar154,fVar139))));
        auVar49._4_4_ = auVar194._4_4_ * fVar153;
        auVar49._0_4_ = auVar194._0_4_ * fVar138;
        auVar49._8_4_ = auVar194._8_4_ * fVar155;
        auVar49._12_4_ = auVar194._12_4_ * fVar157;
        auVar49._16_4_ = auVar194._16_4_ * fVar159;
        auVar49._20_4_ = auVar194._20_4_ * fVar160;
        auVar49._24_4_ = auVar194._24_4_ * fVar161;
        auVar49._28_4_ = auVar147._28_4_;
        auVar17 = vfmadd213ps_fma(local_2de0,(undefined1  [32])vVar15.field_0,auVar49);
        auVar18 = vfmadd213ps_fma(local_2dc0,(undefined1  [32])vVar14.field_0,ZEXT1632(auVar17));
        auVar147 = vrcpps_avx(auVar146);
        auVar255._8_4_ = 0x3f800000;
        auVar255._0_8_ = 0x3f8000003f800000;
        auVar255._12_4_ = 0x3f800000;
        auVar255._16_4_ = 0x3f800000;
        auVar255._20_4_ = 0x3f800000;
        auVar255._24_4_ = 0x3f800000;
        auVar255._28_4_ = 0x3f800000;
        auVar17 = vfnmadd213ps_fma(auVar147,auVar146,auVar255);
        auVar17 = vfmadd132ps_fma(ZEXT1632(auVar17),auVar147,auVar147);
        local_2ba0 = ZEXT1632(CONCAT412((auVar18._12_4_ + auVar18._12_4_) * auVar17._12_4_,
                                        CONCAT48((auVar18._8_4_ + auVar18._8_4_) * auVar17._8_4_,
                                                 CONCAT44((auVar18._4_4_ + auVar18._4_4_) *
                                                          auVar17._4_4_,
                                                          (auVar18._0_4_ + auVar18._0_4_) *
                                                          auVar17._0_4_))));
        auVar147 = vcmpps_avx(*(undefined1 (*) [32])(ray + 0x60),local_2ba0,2);
        auVar195 = vcmpps_avx(local_2ba0,*(undefined1 (*) [32])(ray + 0x100),2);
        auVar147 = vandps_avx(auVar147,auVar195);
        auVar274 = ZEXT3264(local_2d80);
        auVar200._0_8_ = CONCAT44(fVar154,fVar139) ^ 0x8000000080000000;
        auVar200._8_4_ = -fVar156;
        auVar200._12_4_ = -fVar158;
        auVar200._16_4_ = 0x80000000;
        auVar200._20_4_ = 0x80000000;
        auVar200._24_4_ = 0x80000000;
        auVar200._28_4_ = 0x80000000;
        auVar195 = vcmpps_avx(auVar146,auVar200,4);
        auVar147 = vandps_avx(auVar195,auVar147);
        auVar176 = vandps_avx(auVar176,auVar162);
        auVar147 = vpslld_avx2(auVar147,0x1f);
        auVar162 = vpsrad_avx2(auVar147,0x1f);
        auVar147 = auVar176 & auVar162;
        if ((((((((auVar147 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar147 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar147 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar147 >> 0x7f,0) == '\0') &&
              (auVar147 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB321(auVar147 >> 0xbf,0) == '\0') &&
            (auVar147 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < auVar147[0x1f]) goto LAB_015c990b;
        auVar147 = vandps_avx(auVar162,auVar176);
        uVar86 = local_2ca0._0_8_;
        uVar135 = *(undefined4 *)(local_2ca0._0_8_ + 0x34);
        auVar148._4_4_ = uVar135;
        auVar148._0_4_ = uVar135;
        auVar148._8_4_ = uVar135;
        auVar148._12_4_ = uVar135;
        auVar148._16_4_ = uVar135;
        auVar148._20_4_ = uVar135;
        auVar148._24_4_ = uVar135;
        auVar148._28_4_ = uVar135;
        auVar176 = vpand_avx2(auVar148,*(undefined1 (*) [32])(ray + 0x120));
        auVar162 = vpcmpeqd_avx2(auVar176,_DAT_01f7b000);
        auVar176 = auVar147 & ~auVar162;
        if ((((((((auVar176 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar176 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar176 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar176 >> 0x7f,0) == '\0') &&
              (auVar176 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB321(auVar176 >> 0xbf,0) == '\0') &&
            (auVar176 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < auVar176[0x1f]) goto LAB_015c990b;
        auVar147 = vandnps_avx(auVar162,auVar147);
        pRVar128 = context->args;
        if ((pRVar128->filter != (RTCFilterFunctionN)0x0) ||
           (*(long *)(local_2ca0._0_8_ + 0x48) != 0)) {
          local_2de0._0_8_ = lVar134;
          local_2dc0._0_8_ = lVar129;
          auVar176 = vrcpps_avx(auVar141);
          auVar258._8_4_ = 0x3f800000;
          auVar258._0_8_ = 0x3f8000003f800000;
          auVar258._12_4_ = 0x3f800000;
          auVar258._16_4_ = 0x3f800000;
          auVar258._20_4_ = 0x3f800000;
          auVar258._24_4_ = 0x3f800000;
          auVar258._28_4_ = 0x3f800000;
          auVar17 = vfnmadd213ps_fma(auVar141,auVar176,auVar258);
          auVar17 = vfmadd132ps_fma(ZEXT1632(auVar17),auVar176,auVar176);
          auVar150._8_4_ = 0x219392ef;
          auVar150._0_8_ = 0x219392ef219392ef;
          auVar150._12_4_ = 0x219392ef;
          auVar150._16_4_ = 0x219392ef;
          auVar150._20_4_ = 0x219392ef;
          auVar150._24_4_ = 0x219392ef;
          auVar150._28_4_ = 0x219392ef;
          auVar176 = vcmpps_avx(local_26c0,auVar150,5);
          auVar176 = vandps_avx(auVar176,ZEXT1632(auVar17));
          auVar68._4_4_ = auVar176._4_4_ * auVar175._4_4_;
          auVar68._0_4_ = auVar176._0_4_ * auVar175._0_4_;
          auVar68._8_4_ = auVar176._8_4_ * auVar175._8_4_;
          auVar68._12_4_ = auVar176._12_4_ * auVar175._12_4_;
          auVar68._16_4_ = auVar176._16_4_ * 0.0;
          auVar68._20_4_ = auVar176._20_4_ * 0.0;
          auVar68._24_4_ = auVar176._24_4_ * 0.0;
          auVar68._28_4_ = local_26c0._28_4_;
          auVar162 = vminps_avx(auVar68,auVar258);
          auVar69._4_4_ = auVar176._4_4_ * auVar140._4_4_;
          auVar69._0_4_ = auVar176._0_4_ * auVar140._0_4_;
          auVar69._8_4_ = auVar176._8_4_ * auVar140._8_4_;
          auVar69._12_4_ = auVar176._12_4_ * auVar140._12_4_;
          auVar69._16_4_ = auVar176._16_4_ * 0.0;
          auVar69._20_4_ = auVar176._20_4_ * 0.0;
          auVar69._24_4_ = auVar176._24_4_ * 0.0;
          auVar69._28_4_ = auVar176._28_4_;
          auVar176 = vminps_avx(auVar69,auVar258);
          auVar195 = vsubps_avx(auVar258,auVar162);
          auVar146 = vsubps_avx(auVar258,auVar176);
          auVar79._8_8_ = uStack_2718;
          auVar79._0_8_ = local_2720;
          auVar79._16_8_ = uStack_2710;
          auVar79._24_8_ = uStack_2708;
          local_2b60 = vblendvps_avx(auVar162,auVar195,auVar79);
          local_2b80 = vblendvps_avx(auVar176,auVar146,auVar79);
          local_2e80.geometryUserPtr = local_2a00;
          local_2e80.valid = (int *)local_2d40;
          local_2e80.context = (RTCRayQueryContext *)local_29e0;
          local_2e80.ray = (RTCRayN *)local_29c0;
          auVar176 = ZEXT1632(auVar194._0_16_);
          auVar242 = ZEXT1664(auVar20);
          auVar274 = ZEXT1664(auVar272);
          in_ZMM12 = ZEXT1664(auVar19);
          in_ZMM13 = ZEXT1664(auVar260._0_16_);
          in_ZMM14 = ZEXT1664(auVar185._0_16_);
          in_ZMM15 = ZEXT1664(auVar273._0_16_);
          local_2ce0 = auVar147;
          local_2c00.field_0.x.field_0 = (vfloat_impl<8>)(undefined1  [32])vVar14.field_0;
          local_2c00.field_0.y.field_0 = (vfloat_impl<8>)(undefined1  [32])vVar15.field_0;
          local_2c00._64_32_ = auVar194;
          std::
          _Tuple_impl<0ul,embree::vfloat_impl<8>&,embree::vfloat_impl<8>&,embree::vfloat_impl<8>&,embree::Vec3<embree::vfloat_impl<8>>&>
          ::
          _M_assign<embree::vfloat_impl<8>,embree::vfloat_impl<8>,embree::vfloat_impl<8>,embree::Vec3<embree::vfloat_impl<8>>>
                    ((_Tuple_impl<0UL,_embree::vfloat_impl<8>_&,_embree::vfloat_impl<8>_&,_embree::vfloat_impl<8>_&,_embree::Vec3<embree::vfloat_impl<8>_>_&>
                      *)&local_2e80,
                     (_Tuple_impl<0UL,_embree::vfloat_impl<8>,_embree::vfloat_impl<8>,_embree::vfloat_impl<8>,_embree::Vec3<embree::vfloat_impl<8>_>_>
                      *)&local_2c00.field_0);
          auVar162 = vpcmpeqd_avx2(auVar176,auVar176);
          pRVar12 = context->user;
          local_2c00._4_4_ = local_2d40[1];
          local_2c00._0_4_ = local_2d40[0];
          local_2c00._12_4_ = local_2d40[3];
          local_2c00._8_4_ = local_2d40[2];
          local_2c00._20_4_ = fStack_2d2c;
          local_2c00._16_4_ = fStack_2d30;
          local_2c00._28_4_ = fStack_2d24;
          local_2c00._24_4_ = fStack_2d28;
          local_2c00._36_4_ = local_2d20[1];
          local_2c00._32_4_ = local_2d20[0];
          local_2c00._44_4_ = local_2d20[3];
          local_2c00._40_4_ = local_2d20[2];
          local_2c00._52_4_ = fStack_2d0c;
          local_2c00._48_4_ = fStack_2d10;
          local_2c00._60_4_ = uStack_2d04;
          local_2c00._56_4_ = fStack_2d08;
          local_2c00._68_4_ = local_2d00[1];
          local_2c00._64_4_ = local_2d00[0];
          local_2c00._72_4_ = local_2d00[2];
          local_2c00._76_4_ = local_2d00[3];
          local_2c00._80_4_ = fStack_2cf0;
          local_2c00._84_4_ = fStack_2cec;
          local_2c00._88_4_ = fStack_2ce8;
          local_2c00._92_4_ = uStack_2ce4;
          local_2b60._4_4_ = local_2de4;
          local_2b60._0_4_ = local_2de4;
          local_2b60._8_4_ = local_2de4;
          local_2b60._12_4_ = local_2de4;
          local_2b60._16_4_ = local_2de4;
          local_2b60._20_4_ = local_2de4;
          local_2b60._24_4_ = local_2de4;
          local_2b60._28_4_ = local_2de4;
          local_2b40 = (uint)local_2c30;
          uStack_2b3c = (uint)local_2c30;
          uStack_2b38 = (uint)local_2c30;
          uStack_2b34 = (uint)local_2c30;
          uStack_2b30 = (uint)local_2c30;
          uStack_2b2c = (uint)local_2c30;
          uStack_2b28 = (uint)local_2c30;
          uStack_2b24 = (uint)local_2c30;
          local_2d48[1] = auVar162;
          *local_2d48 = auVar162;
          local_2b20 = pRVar12->instID[0];
          uStack_2b1c = local_2b20;
          uStack_2b18 = local_2b20;
          uStack_2b14 = local_2b20;
          uStack_2b10 = local_2b20;
          uStack_2b0c = local_2b20;
          uStack_2b08 = local_2b20;
          uStack_2b04 = local_2b20;
          local_2b00 = pRVar12->instPrimID[0];
          uStack_2afc = local_2b00;
          uStack_2af8 = local_2b00;
          uStack_2af4 = local_2b00;
          uStack_2af0 = local_2b00;
          uStack_2aec = local_2b00;
          uStack_2ae8 = local_2b00;
          uStack_2ae4 = local_2b00;
          auVar176 = *(undefined1 (*) [32])(ray + 0x100);
          auVar147 = vblendvps_avx(auVar176,local_2a00,local_2ce0);
          *(undefined1 (*) [32])(ray + 0x100) = auVar147;
          local_2c80 = local_2ce0;
          local_2e80.geometryUserPtr = (void *)*(undefined8 *)(uVar86 + 0x18);
          local_2e80.valid = (int *)local_2c80;
          local_2e80.context = context->user;
          local_2e80.ray = (RTCRayN *)ray;
          local_2e80.hit = (RTCHitN *)&local_2c00;
          local_2e80.N = 8;
          if (*(code **)(uVar86 + 0x48) != (code *)0x0) {
            auVar147 = ZEXT1632(auVar162._0_16_);
            auVar242 = ZEXT1664(auVar242._0_16_);
            auVar274 = ZEXT1664(auVar274._0_16_);
            in_ZMM12 = ZEXT1664(in_ZMM12._0_16_);
            in_ZMM13 = ZEXT1664(in_ZMM13._0_16_);
            in_ZMM14 = ZEXT1664(in_ZMM14._0_16_);
            in_ZMM15 = ZEXT1664(in_ZMM15._0_16_);
            local_2ce0 = auVar176;
            (**(code **)(uVar86 + 0x48))(&local_2e80);
            auVar162 = vpcmpeqd_avx2(auVar147,auVar147);
            auVar176 = local_2ce0;
          }
          auVar147 = vpcmpeqd_avx2(local_2c80,_DAT_01f7b000);
          auVar194 = auVar162 & ~auVar147;
          if ((((((((auVar194 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar194 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar194 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar194 >> 0x7f,0) == '\0') &&
                (auVar194 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(auVar194 >> 0xbf,0) == '\0') &&
              (auVar194 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar194[0x1f]) {
            auVar147 = auVar147 ^ auVar162;
            lVar129 = local_2dc0._0_8_;
            lVar134 = local_2de0._0_8_;
          }
          else {
            p_Var13 = context->args->filter;
            if ((p_Var13 != (RTCFilterFunctionN)0x0) &&
               (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                 RTC_RAY_QUERY_FLAG_INCOHERENT || ((*(byte *)(uVar86 + 0x3e) & 0x40) != 0)))) {
              auVar147 = ZEXT1632(auVar162._0_16_);
              auVar242 = ZEXT1664(auVar242._0_16_);
              auVar274 = ZEXT1664(auVar274._0_16_);
              in_ZMM12 = ZEXT1664(in_ZMM12._0_16_);
              in_ZMM13 = ZEXT1664(in_ZMM13._0_16_);
              in_ZMM14 = ZEXT1664(in_ZMM14._0_16_);
              in_ZMM15 = ZEXT1664(in_ZMM15._0_16_);
              local_2ce0 = auVar176;
              (*p_Var13)(&local_2e80);
              auVar162 = vpcmpeqd_avx2(auVar147,auVar147);
              auVar176 = local_2ce0;
            }
            auVar194 = vpcmpeqd_avx2(local_2c80,_DAT_01f7b000);
            auVar147 = auVar194 ^ auVar162;
            auVar169._8_4_ = 0xff800000;
            auVar169._0_8_ = 0xff800000ff800000;
            auVar169._12_4_ = 0xff800000;
            auVar169._16_4_ = 0xff800000;
            auVar169._20_4_ = 0xff800000;
            auVar169._24_4_ = 0xff800000;
            auVar169._28_4_ = 0xff800000;
            auVar162 = vblendvps_avx(auVar169,*(undefined1 (*) [32])(local_2e80.ray + 0x100),
                                     auVar194);
            *(undefined1 (*) [32])(local_2e80.ray + 0x100) = auVar162;
            lVar129 = local_2dc0._0_8_;
            lVar134 = local_2de0._0_8_;
          }
          RVar6 = (RTCIntersectArguments)
                  vblendvps_avx(auVar176,(undefined1  [32])*local_2df0,auVar147);
          *local_2df0 = RVar6;
          pRVar128 = local_2df0;
        }
        auVar176 = vandnps_avx(auVar147,local_2e20);
      }
      auVar147 = _local_2da0;
      auVar265 = ZEXT3264(_local_2da0);
      if ((((((((auVar176 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (auVar176 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (auVar176 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(auVar176 >> 0x7f,0) == '\0') &&
            (auVar176 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
           SUB321(auVar176 >> 0xbf,0) == '\0') &&
          (auVar176 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
          -1 < auVar176[0x1f]) break;
      auVar162 = *(undefined1 (*) [32])ray;
      auVar194 = *(undefined1 (*) [32])(ray + 0x20);
      auVar195 = *(undefined1 (*) [32])(ray + 0x40);
      local_2ca0 = vsubps_avx(_local_29a0,auVar162);
      local_2dc0 = vsubps_avx(_local_2960,auVar194);
      local_2de0 = vsubps_avx(_local_2980,auVar195);
      auVar146 = vsubps_avx(local_2640,auVar162);
      auVar228 = vsubps_avx(local_2660,auVar194);
      _local_2da0 = vsubps_avx(local_2680,auVar195);
      auVar162 = vsubps_avx(_local_2cc0,auVar162);
      auVar194 = vsubps_avx(auVar147,auVar194);
      auVar195 = vsubps_avx(_local_2e40,auVar195);
      local_2ce0 = vsubps_avx(auVar162,local_2ca0);
      local_2a40 = vsubps_avx(auVar194,local_2dc0);
      local_2a20 = vsubps_avx(auVar195,local_2de0);
      auVar166._0_4_ = auVar162._0_4_ + local_2ca0._0_4_;
      auVar166._4_4_ = auVar162._4_4_ + local_2ca0._4_4_;
      auVar166._8_4_ = auVar162._8_4_ + local_2ca0._8_4_;
      auVar166._12_4_ = auVar162._12_4_ + local_2ca0._12_4_;
      auVar166._16_4_ = auVar162._16_4_ + local_2ca0._16_4_;
      auVar166._20_4_ = auVar162._20_4_ + local_2ca0._20_4_;
      auVar166._24_4_ = auVar162._24_4_ + local_2ca0._24_4_;
      fVar221 = auVar162._28_4_;
      auVar166._28_4_ = fVar221 + local_2ca0._28_4_;
      local_2e20 = auVar176;
      auVar256._0_4_ = local_2dc0._0_4_ + auVar194._0_4_;
      auVar256._4_4_ = local_2dc0._4_4_ + auVar194._4_4_;
      auVar256._8_4_ = local_2dc0._8_4_ + auVar194._8_4_;
      auVar256._12_4_ = local_2dc0._12_4_ + auVar194._12_4_;
      auVar256._16_4_ = local_2dc0._16_4_ + auVar194._16_4_;
      auVar256._20_4_ = local_2dc0._20_4_ + auVar194._20_4_;
      auVar256._24_4_ = local_2dc0._24_4_ + auVar194._24_4_;
      auVar256._28_4_ = local_2dc0._28_4_ + auVar194._28_4_;
      fVar138 = local_2de0._0_4_;
      auVar264._0_4_ = auVar195._0_4_ + fVar138;
      fVar153 = local_2de0._4_4_;
      auVar264._4_4_ = auVar195._4_4_ + fVar153;
      fVar155 = local_2de0._8_4_;
      auVar264._8_4_ = auVar195._8_4_ + fVar155;
      fVar157 = local_2de0._12_4_;
      auVar264._12_4_ = auVar195._12_4_ + fVar157;
      fVar159 = local_2de0._16_4_;
      auVar264._16_4_ = auVar195._16_4_ + fVar159;
      fVar160 = local_2de0._20_4_;
      auVar264._20_4_ = auVar195._20_4_ + fVar160;
      fVar161 = local_2de0._24_4_;
      auVar264._24_4_ = auVar195._24_4_ + fVar161;
      fVar139 = local_2de0._28_4_;
      auVar264._28_4_ = auVar195._28_4_ + fVar139;
      auVar275._0_4_ = auVar256._0_4_ * local_2a20._0_4_;
      auVar275._4_4_ = auVar256._4_4_ * local_2a20._4_4_;
      auVar275._8_4_ = auVar256._8_4_ * local_2a20._8_4_;
      auVar275._12_4_ = auVar256._12_4_ * local_2a20._12_4_;
      auVar275._16_4_ = auVar256._16_4_ * local_2a20._16_4_;
      auVar275._20_4_ = auVar256._20_4_ * local_2a20._20_4_;
      auVar275._28_36_ = in_ZMM13._28_36_;
      auVar275._24_4_ = auVar256._24_4_ * local_2a20._24_4_;
      auVar140 = vfmsub231ps_fma(auVar275._0_32_,local_2a40,auVar264);
      auVar265._0_4_ = auVar264._0_4_ * local_2ce0._0_4_;
      auVar265._4_4_ = auVar264._4_4_ * local_2ce0._4_4_;
      auVar265._8_4_ = auVar264._8_4_ * local_2ce0._8_4_;
      auVar265._12_4_ = auVar264._12_4_ * local_2ce0._12_4_;
      auVar265._16_4_ = auVar264._16_4_ * local_2ce0._16_4_;
      auVar265._20_4_ = auVar264._20_4_ * local_2ce0._20_4_;
      auVar265._28_36_ = in_ZMM12._28_36_;
      auVar265._24_4_ = auVar264._24_4_ * local_2ce0._24_4_;
      auVar175 = vfmsub231ps_fma(auVar265._0_32_,local_2a20,auVar166);
      auVar50._4_4_ = local_2a40._4_4_ * auVar166._4_4_;
      auVar50._0_4_ = local_2a40._0_4_ * auVar166._0_4_;
      auVar50._8_4_ = local_2a40._8_4_ * auVar166._8_4_;
      auVar50._12_4_ = local_2a40._12_4_ * auVar166._12_4_;
      auVar50._16_4_ = local_2a40._16_4_ * auVar166._16_4_;
      auVar50._20_4_ = local_2a40._20_4_ * auVar166._20_4_;
      auVar50._24_4_ = local_2a40._24_4_ * auVar166._24_4_;
      auVar50._28_4_ = auVar166._28_4_;
      auVar17 = vfmsub231ps_fma(auVar50,local_2ce0,auVar256);
      pRVar1 = ray + 0xc0;
      fVar193 = *(float *)pRVar1;
      fVar203 = *(float *)(ray + 0xc4);
      fVar204 = *(float *)(ray + 200);
      fVar205 = *(float *)(ray + 0xcc);
      fVar206 = *(float *)(ray + 0xd0);
      fVar207 = *(float *)(ray + 0xd4);
      fVar208 = *(float *)(ray + 0xd8);
      auVar80 = *(undefined1 (*) [28])pRVar1;
      auVar51._4_4_ = fVar203 * auVar17._4_4_;
      auVar51._0_4_ = fVar193 * auVar17._0_4_;
      auVar51._8_4_ = fVar204 * auVar17._8_4_;
      auVar51._12_4_ = fVar205 * auVar17._12_4_;
      auVar51._16_4_ = fVar206 * 0.0;
      auVar51._20_4_ = fVar207 * 0.0;
      auVar51._24_4_ = fVar208 * 0.0;
      auVar51._28_4_ = local_2a20._28_4_;
      _local_2cc0 = *(undefined1 (*) [32])(ray + 0xa0);
      auVar175 = vfmadd231ps_fma(auVar51,_local_2cc0,ZEXT1632(auVar175));
      auVar147 = *(undefined1 (*) [32])(ray + 0x80);
      in_ZMM12 = ZEXT3264(auVar147);
      auVar175 = vfmadd231ps_fma(ZEXT1632(auVar175),auVar147,ZEXT1632(auVar140));
      local_2a60 = vsubps_avx(local_2dc0,auVar228);
      in_ZMM13 = ZEXT3264(_local_2da0);
      auVar259 = vsubps_avx(local_2de0,_local_2da0);
      in_ZMM15 = ZEXT3264(auVar259);
      auVar167._0_4_ = local_2dc0._0_4_ + auVar228._0_4_;
      auVar167._4_4_ = local_2dc0._4_4_ + auVar228._4_4_;
      auVar167._8_4_ = local_2dc0._8_4_ + auVar228._8_4_;
      auVar167._12_4_ = local_2dc0._12_4_ + auVar228._12_4_;
      auVar167._16_4_ = local_2dc0._16_4_ + auVar228._16_4_;
      auVar167._20_4_ = local_2dc0._20_4_ + auVar228._20_4_;
      auVar167._24_4_ = local_2dc0._24_4_ + auVar228._24_4_;
      auVar167._28_4_ = local_2dc0._28_4_ + auVar228._28_4_;
      auVar257._0_4_ = local_2da0._0_4_ + fVar138;
      auVar257._4_4_ = local_2da0._4_4_ + fVar153;
      auVar257._8_4_ = local_2da0._8_4_ + fVar155;
      auVar257._12_4_ = local_2da0._12_4_ + fVar157;
      auVar257._16_4_ = local_2da0._16_4_ + fVar159;
      auVar257._20_4_ = local_2da0._20_4_ + fVar160;
      auVar257._24_4_ = local_2da0._24_4_ + fVar161;
      auVar257._28_4_ = local_2da0._28_4_ + fVar139;
      fVar286 = auVar259._0_4_;
      fVar288 = auVar259._4_4_;
      auVar52._4_4_ = fVar288 * auVar167._4_4_;
      auVar52._0_4_ = fVar286 * auVar167._0_4_;
      fVar289 = auVar259._8_4_;
      auVar52._8_4_ = fVar289 * auVar167._8_4_;
      fVar290 = auVar259._12_4_;
      auVar52._12_4_ = fVar290 * auVar167._12_4_;
      fVar291 = auVar259._16_4_;
      auVar52._16_4_ = fVar291 * auVar167._16_4_;
      fVar292 = auVar259._20_4_;
      auVar52._20_4_ = fVar292 * auVar167._20_4_;
      fVar293 = auVar259._24_4_;
      auVar52._24_4_ = fVar293 * auVar167._24_4_;
      auVar52._28_4_ = fVar139;
      auVar17 = vfmsub231ps_fma(auVar52,local_2a60,auVar257);
      auVar260 = vsubps_avx(local_2ca0,auVar146);
      in_ZMM14 = ZEXT3264(auVar260);
      fVar139 = auVar260._0_4_;
      fVar156 = auVar260._4_4_;
      auVar53._4_4_ = auVar257._4_4_ * fVar156;
      auVar53._0_4_ = auVar257._0_4_ * fVar139;
      fVar243 = auVar260._8_4_;
      auVar53._8_4_ = auVar257._8_4_ * fVar243;
      fVar245 = auVar260._12_4_;
      auVar53._12_4_ = auVar257._12_4_ * fVar245;
      fVar187 = auVar260._16_4_;
      auVar53._16_4_ = auVar257._16_4_ * fVar187;
      fVar189 = auVar260._20_4_;
      auVar53._20_4_ = auVar257._20_4_ * fVar189;
      fVar191 = auVar260._24_4_;
      auVar53._24_4_ = auVar257._24_4_ * fVar191;
      auVar53._28_4_ = auVar257._28_4_;
      auVar241._0_4_ = local_2ca0._0_4_ + auVar146._0_4_;
      auVar241._4_4_ = local_2ca0._4_4_ + auVar146._4_4_;
      auVar241._8_4_ = local_2ca0._8_4_ + auVar146._8_4_;
      auVar241._12_4_ = local_2ca0._12_4_ + auVar146._12_4_;
      auVar241._16_4_ = local_2ca0._16_4_ + auVar146._16_4_;
      auVar241._20_4_ = local_2ca0._20_4_ + auVar146._20_4_;
      auVar241._24_4_ = local_2ca0._24_4_ + auVar146._24_4_;
      auVar241._28_4_ = local_2ca0._28_4_ + auVar146._28_4_;
      auVar140 = vfmsub231ps_fma(auVar53,auVar259,auVar241);
      fVar154 = local_2a60._0_4_;
      fVar158 = local_2a60._4_4_;
      auVar54._4_4_ = auVar241._4_4_ * fVar158;
      auVar54._0_4_ = auVar241._0_4_ * fVar154;
      fVar244 = local_2a60._8_4_;
      auVar54._8_4_ = auVar241._8_4_ * fVar244;
      fVar174 = local_2a60._12_4_;
      auVar54._12_4_ = auVar241._12_4_ * fVar174;
      fVar188 = local_2a60._16_4_;
      auVar54._16_4_ = auVar241._16_4_ * fVar188;
      fVar190 = local_2a60._20_4_;
      auVar54._20_4_ = auVar241._20_4_ * fVar190;
      fVar192 = local_2a60._24_4_;
      auVar54._24_4_ = auVar241._24_4_ * fVar192;
      auVar54._28_4_ = auVar241._28_4_;
      auVar272 = vfmsub231ps_fma(auVar54,auVar260,auVar167);
      auVar55._4_4_ = fVar203 * auVar272._4_4_;
      auVar55._0_4_ = fVar193 * auVar272._0_4_;
      auVar55._8_4_ = fVar204 * auVar272._8_4_;
      auVar55._12_4_ = fVar205 * auVar272._12_4_;
      auVar55._16_4_ = fVar206 * 0.0;
      auVar55._20_4_ = fVar207 * 0.0;
      auVar55._24_4_ = fVar208 * 0.0;
      auVar55._28_4_ = auVar167._28_4_;
      auVar140 = vfmadd231ps_fma(auVar55,_local_2cc0,ZEXT1632(auVar140));
      auVar140 = vfmadd231ps_fma(ZEXT1632(auVar140),auVar147,ZEXT1632(auVar17));
      auVar273 = vsubps_avx(auVar146,auVar162);
      auVar182._0_4_ = auVar146._0_4_ + auVar162._0_4_;
      auVar182._4_4_ = auVar146._4_4_ + auVar162._4_4_;
      auVar182._8_4_ = auVar146._8_4_ + auVar162._8_4_;
      auVar182._12_4_ = auVar146._12_4_ + auVar162._12_4_;
      auVar182._16_4_ = auVar146._16_4_ + auVar162._16_4_;
      auVar182._20_4_ = auVar146._20_4_ + auVar162._20_4_;
      auVar182._24_4_ = auVar146._24_4_ + auVar162._24_4_;
      auVar182._28_4_ = auVar146._28_4_ + fVar221;
      auVar146 = vsubps_avx(auVar228,auVar194);
      auVar201._0_4_ = auVar228._0_4_ + auVar194._0_4_;
      auVar201._4_4_ = auVar228._4_4_ + auVar194._4_4_;
      auVar201._8_4_ = auVar228._8_4_ + auVar194._8_4_;
      auVar201._12_4_ = auVar228._12_4_ + auVar194._12_4_;
      auVar201._16_4_ = auVar228._16_4_ + auVar194._16_4_;
      auVar201._20_4_ = auVar228._20_4_ + auVar194._20_4_;
      auVar201._24_4_ = auVar228._24_4_ + auVar194._24_4_;
      auVar201._28_4_ = auVar228._28_4_ + auVar194._28_4_;
      auVar228 = vsubps_avx(_local_2da0,auVar195);
      auVar274 = ZEXT3264(auVar228);
      auVar149._0_4_ = local_2da0._0_4_ + auVar195._0_4_;
      auVar149._4_4_ = local_2da0._4_4_ + auVar195._4_4_;
      auVar149._8_4_ = local_2da0._8_4_ + auVar195._8_4_;
      auVar149._12_4_ = local_2da0._12_4_ + auVar195._12_4_;
      auVar149._16_4_ = local_2da0._16_4_ + auVar195._16_4_;
      auVar149._20_4_ = local_2da0._20_4_ + auVar195._20_4_;
      auVar149._24_4_ = local_2da0._24_4_ + auVar195._24_4_;
      auVar149._28_4_ = local_2da0._28_4_ + auVar195._28_4_;
      auVar56._4_4_ = auVar228._4_4_ * auVar201._4_4_;
      auVar56._0_4_ = auVar228._0_4_ * auVar201._0_4_;
      auVar56._8_4_ = auVar228._8_4_ * auVar201._8_4_;
      auVar56._12_4_ = auVar228._12_4_ * auVar201._12_4_;
      auVar56._16_4_ = auVar228._16_4_ * auVar201._16_4_;
      auVar56._20_4_ = auVar228._20_4_ * auVar201._20_4_;
      auVar56._24_4_ = auVar228._24_4_ * auVar201._24_4_;
      auVar56._28_4_ = fVar221;
      auVar272 = vfmsub231ps_fma(auVar56,auVar146,auVar149);
      auVar57._4_4_ = auVar273._4_4_ * auVar149._4_4_;
      auVar57._0_4_ = auVar273._0_4_ * auVar149._0_4_;
      auVar57._8_4_ = auVar273._8_4_ * auVar149._8_4_;
      auVar57._12_4_ = auVar273._12_4_ * auVar149._12_4_;
      auVar57._16_4_ = auVar273._16_4_ * auVar149._16_4_;
      auVar57._20_4_ = auVar273._20_4_ * auVar149._20_4_;
      auVar57._24_4_ = auVar273._24_4_ * auVar149._24_4_;
      auVar57._28_4_ = auVar149._28_4_;
      auVar17 = vfmsub231ps_fma(auVar57,auVar228,auVar182);
      auVar58._4_4_ = auVar182._4_4_ * auVar146._4_4_;
      auVar58._0_4_ = auVar182._0_4_ * auVar146._0_4_;
      auVar58._8_4_ = auVar182._8_4_ * auVar146._8_4_;
      auVar58._12_4_ = auVar182._12_4_ * auVar146._12_4_;
      auVar58._16_4_ = auVar182._16_4_ * auVar146._16_4_;
      auVar58._20_4_ = auVar182._20_4_ * auVar146._20_4_;
      auVar58._24_4_ = auVar182._24_4_ * auVar146._24_4_;
      auVar58._28_4_ = auVar182._28_4_;
      auVar18 = vfmsub231ps_fma(auVar58,auVar273,auVar201);
      _local_2e40 = *(undefined1 (*) [32])pRVar1;
      auVar16 = _local_2e40;
      auVar183._0_4_ = fVar193 * auVar18._0_4_;
      auVar183._4_4_ = fVar203 * auVar18._4_4_;
      auVar183._8_4_ = fVar204 * auVar18._8_4_;
      auVar183._12_4_ = fVar205 * auVar18._12_4_;
      auVar183._16_4_ = fVar206 * 0.0;
      auVar183._20_4_ = fVar207 * 0.0;
      auVar183._24_4_ = fVar208 * 0.0;
      auVar183._28_4_ = 0;
      auVar265 = ZEXT3264(_local_2cc0);
      auVar17 = vfmadd231ps_fma(auVar183,_local_2cc0,ZEXT1632(auVar17));
      auVar17 = vfmadd231ps_fma(ZEXT1632(auVar17),auVar147,ZEXT1632(auVar272));
      auVar141 = ZEXT1632(CONCAT412(auVar17._12_4_ + auVar175._12_4_ + auVar140._12_4_,
                                    CONCAT48(auVar17._8_4_ + auVar175._8_4_ + auVar140._8_4_,
                                             CONCAT44(auVar17._4_4_ +
                                                      auVar175._4_4_ + auVar140._4_4_,
                                                      auVar17._0_4_ +
                                                      auVar175._0_4_ + auVar140._0_4_))));
      auVar242 = ZEXT3264(auVar141);
      _local_2a80 = ZEXT1632(auVar175);
      auVar162 = vminps_avx(_local_2a80,ZEXT1632(auVar140));
      auVar162 = vminps_avx(auVar162,ZEXT1632(auVar17));
      local_2aa0 = vandps_avx(auVar141,local_2940);
      fVar193 = local_2aa0._0_4_ * 1.1920929e-07;
      fVar203 = local_2aa0._4_4_ * 1.1920929e-07;
      auVar59._4_4_ = fVar203;
      auVar59._0_4_ = fVar193;
      fVar204 = local_2aa0._8_4_ * 1.1920929e-07;
      auVar59._8_4_ = fVar204;
      fVar205 = local_2aa0._12_4_ * 1.1920929e-07;
      auVar59._12_4_ = fVar205;
      fVar206 = local_2aa0._16_4_ * 1.1920929e-07;
      auVar59._16_4_ = fVar206;
      fVar207 = local_2aa0._20_4_ * 1.1920929e-07;
      auVar59._20_4_ = fVar207;
      fVar208 = local_2aa0._24_4_ * 1.1920929e-07;
      auVar59._24_4_ = fVar208;
      auVar59._28_4_ = 0x34000000;
      auVar217._0_4_ = (uint)fVar193 ^ local_2d80._0_4_;
      auVar217._4_4_ = (uint)fVar203 ^ local_2d80._4_4_;
      auVar217._8_4_ = (uint)fVar204 ^ local_2d80._8_4_;
      auVar217._12_4_ = (uint)fVar205 ^ local_2d80._12_4_;
      auVar217._16_4_ = (uint)fVar206 ^ local_2d80._16_4_;
      auVar217._20_4_ = (uint)fVar207 ^ local_2d80._20_4_;
      auVar217._24_4_ = (uint)fVar208 ^ local_2d80._24_4_;
      auVar217._28_4_ = local_2d80._28_4_ ^ 0x34000000;
      auVar162 = vcmpps_avx(auVar162,auVar217,5);
      auVar195 = vmaxps_avx(_local_2a80,ZEXT1632(auVar140));
      auVar194 = vmaxps_avx(auVar195,ZEXT1632(auVar17));
      auVar194 = vcmpps_avx(auVar194,auVar59,2);
      auVar162 = vorps_avx(auVar162,auVar194);
      auVar185 = auVar176 & auVar162;
      _local_2e40 = auVar16;
      if ((((((((auVar185 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (auVar185 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (auVar185 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(auVar185 >> 0x7f,0) == '\0') &&
            (auVar185 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
           SUB321(auVar185 >> 0xbf,0) == '\0') &&
          (auVar185 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
          -1 < auVar185[0x1f]) {
        auVar186 = ZEXT3264(auVar176);
      }
      else {
        local_2ac0 = auVar141;
        _local_2da0 = auVar162;
        in_ZMM13 = ZEXT3264(local_2a60);
        auVar60._4_4_ = fVar158 * local_2a20._4_4_;
        auVar60._0_4_ = fVar154 * local_2a20._0_4_;
        auVar60._8_4_ = fVar244 * local_2a20._8_4_;
        auVar60._12_4_ = fVar174 * local_2a20._12_4_;
        auVar60._16_4_ = fVar188 * local_2a20._16_4_;
        auVar60._20_4_ = fVar190 * local_2a20._20_4_;
        auVar60._24_4_ = fVar192 * local_2a20._24_4_;
        auVar60._28_4_ = auVar162._28_4_;
        auVar61._4_4_ = fVar156 * local_2a40._4_4_;
        auVar61._0_4_ = fVar139 * local_2a40._0_4_;
        auVar61._8_4_ = fVar243 * local_2a40._8_4_;
        auVar61._12_4_ = fVar245 * local_2a40._12_4_;
        auVar61._16_4_ = fVar187 * local_2a40._16_4_;
        auVar61._20_4_ = fVar189 * local_2a40._20_4_;
        auVar61._24_4_ = fVar191 * local_2a40._24_4_;
        auVar61._28_4_ = auVar194._28_4_;
        auVar17 = vfmsub213ps_fma(local_2a40,auVar259,auVar60);
        auVar62._4_4_ = fVar288 * auVar146._4_4_;
        auVar62._0_4_ = fVar286 * auVar146._0_4_;
        auVar62._8_4_ = fVar289 * auVar146._8_4_;
        auVar62._12_4_ = fVar290 * auVar146._12_4_;
        auVar62._16_4_ = fVar291 * auVar146._16_4_;
        auVar62._20_4_ = fVar292 * auVar146._20_4_;
        auVar62._24_4_ = fVar293 * auVar146._24_4_;
        auVar62._28_4_ = 0x34000000;
        auVar63._4_4_ = fVar156 * auVar228._4_4_;
        auVar63._0_4_ = fVar139 * auVar228._0_4_;
        auVar63._8_4_ = fVar243 * auVar228._8_4_;
        auVar63._12_4_ = fVar245 * auVar228._12_4_;
        auVar63._16_4_ = fVar187 * auVar228._16_4_;
        auVar63._20_4_ = fVar189 * auVar228._20_4_;
        auVar63._24_4_ = fVar191 * auVar228._24_4_;
        auVar63._28_4_ = auVar195._28_4_;
        auVar272 = vfmsub213ps_fma(auVar228,local_2a60,auVar62);
        auVar194 = vandps_avx(auVar60,local_2940);
        auVar195 = vandps_avx(auVar62,local_2940);
        auVar194 = vcmpps_avx(auVar194,auVar195,1);
        vVar14.field_0 =
             (anon_union_32_3_4e90abd3_for_vfloat_impl<8>_1)
             vblendvps_avx(ZEXT1632(auVar272),ZEXT1632(auVar17),auVar194);
        auVar64._4_4_ = auVar273._4_4_ * fVar158;
        auVar64._0_4_ = auVar273._0_4_ * fVar154;
        auVar64._8_4_ = auVar273._8_4_ * fVar244;
        auVar64._12_4_ = auVar273._12_4_ * fVar174;
        auVar64._16_4_ = auVar273._16_4_ * fVar188;
        auVar64._20_4_ = auVar273._20_4_ * fVar190;
        auVar64._24_4_ = auVar273._24_4_ * fVar192;
        auVar64._28_4_ = auVar194._28_4_;
        auVar17 = vfmsub213ps_fma(auVar273,auVar259,auVar63);
        auVar65._4_4_ = local_2ce0._4_4_ * fVar288;
        auVar65._0_4_ = local_2ce0._0_4_ * fVar286;
        auVar65._8_4_ = local_2ce0._8_4_ * fVar289;
        auVar65._12_4_ = local_2ce0._12_4_ * fVar290;
        auVar65._16_4_ = local_2ce0._16_4_ * fVar291;
        auVar65._20_4_ = local_2ce0._20_4_ * fVar292;
        auVar65._24_4_ = local_2ce0._24_4_ * fVar293;
        auVar65._28_4_ = auVar195._28_4_;
        auVar272 = vfmsub213ps_fma(local_2a20,auVar260,auVar65);
        auVar194 = vandps_avx(auVar65,local_2940);
        auVar195 = vandps_avx(auVar63,local_2940);
        auVar194 = vcmpps_avx(auVar194,auVar195,1);
        vVar15.field_0 =
             (anon_union_32_3_4e90abd3_for_vfloat_impl<8>_1)
             vblendvps_avx(ZEXT1632(auVar17),ZEXT1632(auVar272),auVar194);
        auVar242 = ZEXT3264((undefined1  [32])vVar15.field_0);
        auVar20 = vfmsub213ps_fma(local_2ce0,local_2a60,auVar61);
        auVar274 = ZEXT1664(auVar20);
        auVar17 = vfmsub213ps_fma(auVar146,auVar260,auVar64);
        auVar194 = vandps_avx(auVar61,local_2940);
        auVar195 = vandps_avx(auVar64,local_2940);
        auVar146 = vcmpps_avx(auVar194,auVar195,1);
        auVar195 = vblendvps_avx(ZEXT1632(auVar17),ZEXT1632(auVar20),auVar146);
        local_2e40._0_4_ = auVar80._0_4_;
        local_2e40._4_4_ = auVar80._4_4_;
        auStack_2e38._0_4_ = auVar80._8_4_;
        auStack_2e38._4_4_ = auVar80._12_4_;
        fStack_2e30 = auVar80._16_4_;
        fStack_2e2c = auVar80._20_4_;
        fStack_2e28 = auVar80._24_4_;
        auVar66._4_4_ = auVar195._4_4_ * (float)local_2e40._4_4_;
        auVar66._0_4_ = auVar195._0_4_ * (float)local_2e40._0_4_;
        auVar66._8_4_ = auVar195._8_4_ * (float)auStack_2e38._0_4_;
        auVar66._12_4_ = auVar195._12_4_ * (float)auStack_2e38._4_4_;
        auVar66._16_4_ = auVar195._16_4_ * fStack_2e30;
        auVar66._20_4_ = auVar195._20_4_ * fStack_2e2c;
        auVar66._24_4_ = auVar195._24_4_ * fStack_2e28;
        auVar66._28_4_ = auVar146._28_4_;
        auVar272 = vfmadd213ps_fma(_local_2cc0,(undefined1  [32])vVar15.field_0,auVar66);
        auVar265 = ZEXT1664(auVar272);
        auVar18 = vfmadd213ps_fma(auVar147,(undefined1  [32])vVar14.field_0,ZEXT1632(auVar272));
        in_ZMM12 = ZEXT1664(auVar18);
        fVar139 = auVar18._0_4_ + auVar18._0_4_;
        fVar154 = auVar18._4_4_ + auVar18._4_4_;
        fVar156 = auVar18._8_4_ + auVar18._8_4_;
        fVar158 = auVar18._12_4_ + auVar18._12_4_;
        auVar146 = ZEXT1632(CONCAT412(fVar158,CONCAT48(fVar156,CONCAT44(fVar154,fVar139))));
        auVar67._4_4_ = auVar195._4_4_ * fVar153;
        auVar67._0_4_ = auVar195._0_4_ * fVar138;
        auVar67._8_4_ = auVar195._8_4_ * fVar155;
        auVar67._12_4_ = auVar195._12_4_ * fVar157;
        auVar67._16_4_ = auVar195._16_4_ * fVar159;
        auVar67._20_4_ = auVar195._20_4_ * fVar160;
        auVar67._24_4_ = auVar195._24_4_ * fVar161;
        auVar67._28_4_ = auVar194._28_4_;
        auVar17 = vfmadd213ps_fma(local_2dc0,(undefined1  [32])vVar15.field_0,auVar67);
        auVar19 = vfmadd213ps_fma(local_2ca0,(undefined1  [32])vVar14.field_0,ZEXT1632(auVar17));
        auVar147 = vrcpps_avx(auVar146);
        auVar236._8_4_ = 0x3f800000;
        auVar236._0_8_ = 0x3f8000003f800000;
        auVar236._12_4_ = 0x3f800000;
        auVar236._16_4_ = 0x3f800000;
        auVar236._20_4_ = 0x3f800000;
        auVar236._24_4_ = 0x3f800000;
        auVar236._28_4_ = 0x3f800000;
        auVar17 = vfnmadd213ps_fma(auVar147,auVar146,auVar236);
        auVar17 = vfmadd132ps_fma(ZEXT1632(auVar17),auVar147,auVar147);
        local_2ba0 = ZEXT1632(CONCAT412((auVar19._12_4_ + auVar19._12_4_) * auVar17._12_4_,
                                        CONCAT48((auVar19._8_4_ + auVar19._8_4_) * auVar17._8_4_,
                                                 CONCAT44((auVar19._4_4_ + auVar19._4_4_) *
                                                          auVar17._4_4_,
                                                          (auVar19._0_4_ + auVar19._0_4_) *
                                                          auVar17._0_4_))));
        auVar147 = vcmpps_avx(*(undefined1 (*) [32])(ray + 0x60),local_2ba0,2);
        auVar194 = vcmpps_avx(local_2ba0,*(undefined1 (*) [32])(ray + 0x100),2);
        auVar147 = vandps_avx(auVar147,auVar194);
        auVar218._0_4_ = (uint)fVar139 ^ local_2d80._0_4_;
        auVar218._4_4_ = (uint)fVar154 ^ local_2d80._4_4_;
        auVar218._8_4_ = (uint)fVar156 ^ local_2d80._8_4_;
        auVar218._12_4_ = (uint)fVar158 ^ local_2d80._12_4_;
        auVar218._16_4_ = local_2d80._16_4_;
        auVar218._20_4_ = local_2d80._20_4_;
        auVar218._24_4_ = local_2d80._24_4_;
        auVar218._28_4_ = local_2d80._28_4_;
        auVar194 = vcmpps_avx(auVar146,auVar218,4);
        auVar147 = vandps_avx(auVar194,auVar147);
        auVar186 = ZEXT3264(auVar176);
        auVar176 = vandps_avx(auVar176,auVar162);
        auVar147 = vpslld_avx2(auVar147,0x1f);
        auVar162 = vpsrad_avx2(auVar147,0x1f);
        auVar147 = auVar176 & auVar162;
        if ((((((((auVar147 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar147 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar147 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar147 >> 0x7f,0) != '\0') ||
              (auVar147 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar147 >> 0xbf,0) != '\0') ||
            (auVar147 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar147[0x1f] < '\0') {
          auVar147 = vandps_avx(auVar162,auVar176);
          uVar136 = *(uint *)(lVar129 + 0x40 + lVar134 * 4);
          pRVar128 = (RTCIntersectArguments *)(context->scene->geometries).items;
          lVar130 = *(long *)(&pRVar128->flags + (ulong)uVar136 * 2);
          uVar135 = *(undefined4 *)(lVar130 + 0x34);
          auVar202._4_4_ = uVar135;
          auVar202._0_4_ = uVar135;
          auVar202._8_4_ = uVar135;
          auVar202._12_4_ = uVar135;
          auVar202._16_4_ = uVar135;
          auVar202._20_4_ = uVar135;
          auVar202._24_4_ = uVar135;
          auVar202._28_4_ = uVar135;
          auVar176 = vpand_avx2(auVar202,*(undefined1 (*) [32])(ray + 0x120));
          auVar162 = vpcmpeqd_avx2(auVar176,_DAT_01f7b000);
          auVar176 = auVar147 & ~auVar162;
          if ((((((((auVar176 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar176 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar176 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar176 >> 0x7f,0) != '\0') ||
                (auVar176 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar176 >> 0xbf,0) != '\0') ||
              (auVar176 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar176[0x1f] < '\0') {
            local_2d80._0_4_ = *(undefined4 *)(lVar129 + 0x50 + lVar134 * 4);
            auVar147 = vandnps_avx(auVar162,auVar147);
            pRVar128 = context->args;
            if ((pRVar128->filter != (RTCFilterFunctionN)0x0) || (*(long *)(lVar130 + 0x48) != 0)) {
              local_2de0._0_8_ = lVar134;
              local_2dc0._0_8_ = lVar129;
              auVar176 = vrcpps_avx(auVar141);
              auVar219._8_4_ = 0x3f800000;
              auVar219._0_8_ = 0x3f8000003f800000;
              auVar219._12_4_ = 0x3f800000;
              auVar219._16_4_ = 0x3f800000;
              auVar219._20_4_ = 0x3f800000;
              auVar219._24_4_ = 0x3f800000;
              auVar219._28_4_ = 0x3f800000;
              auVar17 = vfnmadd213ps_fma(auVar141,auVar176,auVar219);
              auVar17 = vfmadd132ps_fma(ZEXT1632(auVar17),auVar176,auVar176);
              auVar151._8_4_ = 0x219392ef;
              auVar151._0_8_ = 0x219392ef219392ef;
              auVar151._12_4_ = 0x219392ef;
              auVar151._16_4_ = 0x219392ef;
              auVar151._20_4_ = 0x219392ef;
              auVar151._24_4_ = 0x219392ef;
              auVar151._28_4_ = 0x219392ef;
              auVar176 = vcmpps_avx(local_2aa0,auVar151,5);
              auVar176 = vandps_avx(auVar176,ZEXT1632(auVar17));
              auVar70._4_4_ = auVar176._4_4_ * auVar175._4_4_;
              auVar70._0_4_ = auVar176._0_4_ * auVar175._0_4_;
              auVar70._8_4_ = auVar176._8_4_ * auVar175._8_4_;
              auVar70._12_4_ = auVar176._12_4_ * auVar175._12_4_;
              auVar70._16_4_ = auVar176._16_4_ * 0.0;
              auVar70._20_4_ = auVar176._20_4_ * 0.0;
              auVar70._24_4_ = auVar176._24_4_ * 0.0;
              auVar70._28_4_ = local_2aa0._28_4_;
              auVar162 = vminps_avx(auVar70,auVar219);
              auVar71._4_4_ = auVar140._4_4_ * auVar176._4_4_;
              auVar71._0_4_ = auVar140._0_4_ * auVar176._0_4_;
              auVar71._8_4_ = auVar140._8_4_ * auVar176._8_4_;
              auVar71._12_4_ = auVar140._12_4_ * auVar176._12_4_;
              auVar71._16_4_ = auVar176._16_4_ * 0.0;
              auVar71._20_4_ = auVar176._20_4_ * 0.0;
              auVar71._24_4_ = auVar176._24_4_ * 0.0;
              auVar71._28_4_ = auVar176._28_4_;
              auVar176 = vminps_avx(auVar71,auVar219);
              auVar194 = vsubps_avx(auVar219,auVar162);
              auVar146 = vsubps_avx(auVar219,auVar176);
              auVar78._8_8_ = uStack_2738;
              auVar78._0_8_ = local_2740;
              auVar78._16_8_ = uStack_2730;
              auVar78._24_8_ = uStack_2728;
              local_2b60 = vblendvps_avx(auVar162,auVar194,auVar78);
              local_2b80 = vblendvps_avx(auVar176,auVar146,auVar78);
              local_2e80.geometryUserPtr = local_2a00;
              local_2e80.valid = (int *)local_2d40;
              local_2e80.context = (RTCRayQueryContext *)local_29e0;
              local_2e80.ray = (RTCRayN *)local_29c0;
              _auStack_2e38 = SUB3224(*(undefined1 (*) [32])pRVar1,8);
              local_2e40 = (undefined1  [8])lVar130;
              auVar242 = ZEXT1664(vVar15.field_0._0_16_);
              auVar265 = ZEXT1664(auVar272);
              auVar274 = ZEXT1664(auVar20);
              in_ZMM12 = ZEXT1664(auVar18);
              in_ZMM13 = ZEXT1664(local_2a60._0_16_);
              in_ZMM14 = ZEXT1664(auVar260._0_16_);
              in_ZMM15 = ZEXT1664(auVar259._0_16_);
              _local_2da0 = auVar147;
              local_2c00.field_0.x.field_0 = (vfloat_impl<8>)(undefined1  [32])vVar14.field_0;
              local_2c00.field_0.y.field_0 = (vfloat_impl<8>)(undefined1  [32])vVar15.field_0;
              local_2c00._64_32_ = auVar195;
              std::
              _Tuple_impl<0ul,embree::vfloat_impl<8>&,embree::vfloat_impl<8>&,embree::vfloat_impl<8>&,embree::Vec3<embree::vfloat_impl<8>>&>
              ::
              _M_assign<embree::vfloat_impl<8>,embree::vfloat_impl<8>,embree::vfloat_impl<8>,embree::Vec3<embree::vfloat_impl<8>>>
                        ((_Tuple_impl<0UL,_embree::vfloat_impl<8>_&,_embree::vfloat_impl<8>_&,_embree::vfloat_impl<8>_&,_embree::Vec3<embree::vfloat_impl<8>_>_&>
                          *)&local_2e80,
                         (_Tuple_impl<0UL,_embree::vfloat_impl<8>,_embree::vfloat_impl<8>,_embree::vfloat_impl<8>,_embree::Vec3<embree::vfloat_impl<8>_>_>
                          *)&local_2c00.field_0);
              pRVar12 = context->user;
              local_2b60._4_4_ = local_2d80._0_4_;
              local_2b60._0_4_ = local_2d80._0_4_;
              local_2b60._8_4_ = local_2d80._0_4_;
              local_2b60._12_4_ = local_2d80._0_4_;
              local_2b60._16_4_ = local_2d80._0_4_;
              local_2b60._20_4_ = local_2d80._0_4_;
              local_2b60._24_4_ = local_2d80._0_4_;
              local_2b60._28_4_ = local_2d80._0_4_;
              local_2c00._4_4_ = local_2d40[1];
              local_2c00._0_4_ = local_2d40[0];
              local_2c00._12_4_ = local_2d40[3];
              local_2c00._8_4_ = local_2d40[2];
              local_2c00._20_4_ = fStack_2d2c;
              local_2c00._16_4_ = fStack_2d30;
              local_2c00._28_4_ = fStack_2d24;
              local_2c00._24_4_ = fStack_2d28;
              local_2c00._36_4_ = local_2d20[1];
              local_2c00._32_4_ = local_2d20[0];
              local_2c00._44_4_ = local_2d20[3];
              local_2c00._40_4_ = local_2d20[2];
              local_2c00._52_4_ = fStack_2d0c;
              local_2c00._48_4_ = fStack_2d10;
              local_2c00._60_4_ = uStack_2d04;
              local_2c00._56_4_ = fStack_2d08;
              local_2c00._68_4_ = local_2d00[1];
              local_2c00._64_4_ = local_2d00[0];
              local_2c00._76_4_ = local_2d00[3];
              local_2c00._72_4_ = local_2d00[2];
              local_2c00._84_4_ = fStack_2cec;
              local_2c00._80_4_ = fStack_2cf0;
              local_2c00._92_4_ = uStack_2ce4;
              local_2c00._88_4_ = fStack_2ce8;
              local_2b40 = uVar136;
              uStack_2b3c = uVar136;
              uStack_2b38 = uVar136;
              uStack_2b34 = uVar136;
              uStack_2b30 = uVar136;
              uStack_2b2c = uVar136;
              uStack_2b28 = uVar136;
              uStack_2b24 = uVar136;
              auVar176 = vpcmpeqd_avx2(local_2b60,local_2b60);
              local_2d48[1] = auVar176;
              *local_2d48 = auVar176;
              local_2b20 = pRVar12->instID[0];
              uStack_2b1c = local_2b20;
              uStack_2b18 = local_2b20;
              uStack_2b14 = local_2b20;
              uStack_2b10 = local_2b20;
              uStack_2b0c = local_2b20;
              uStack_2b08 = local_2b20;
              uStack_2b04 = local_2b20;
              local_2b00 = pRVar12->instPrimID[0];
              uStack_2afc = local_2b00;
              uStack_2af8 = local_2b00;
              uStack_2af4 = local_2b00;
              uStack_2af0 = local_2b00;
              uStack_2aec = local_2b00;
              uStack_2ae8 = local_2b00;
              uStack_2ae4 = local_2b00;
              local_2d80 = *(undefined1 (*) [32])(ray + 0x100);
              auVar147 = vblendvps_avx(local_2d80,local_2a00,_local_2da0);
              *(undefined1 (*) [32])(ray + 0x100) = auVar147;
              local_2c80 = _local_2da0;
              local_2e80.geometryUserPtr = (void *)*(undefined8 *)((long)local_2e40 + 0x18);
              local_2e80.valid = (int *)local_2c80;
              local_2e80.context = context->user;
              local_2e80.ray = (RTCRayN *)ray;
              local_2e80.hit = (RTCHitN *)&local_2c00;
              local_2e80.N = 8;
              if (*(code **)((long)local_2e40 + 0x48) != (code *)0x0) {
                auVar242 = ZEXT1664(auVar242._0_16_);
                auVar265 = ZEXT1664(auVar265._0_16_);
                auVar274 = ZEXT1664(auVar274._0_16_);
                in_ZMM12 = ZEXT1664(in_ZMM12._0_16_);
                in_ZMM13 = ZEXT1664(in_ZMM13._0_16_);
                in_ZMM14 = ZEXT1664(in_ZMM14._0_16_);
                in_ZMM15 = ZEXT1664(in_ZMM15._0_16_);
                (**(code **)((long)local_2e40 + 0x48))(&local_2e80);
                auVar173._8_56_ = extraout_var;
                auVar173._0_8_ = extraout_XMM1_Qa;
                auVar176 = vpcmpeqd_avx2(auVar173._0_32_,auVar173._0_32_);
              }
              auVar147 = vpcmpeqd_avx2(local_2c80,_DAT_01f7b000);
              auVar162 = auVar176 & ~auVar147;
              if ((((((((auVar162 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                       (auVar162 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                      (auVar162 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                     SUB321(auVar162 >> 0x7f,0) == '\0') &&
                    (auVar162 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                   SUB321(auVar162 >> 0xbf,0) == '\0') &&
                  (auVar162 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                  -1 < auVar162[0x1f]) {
                auVar147 = auVar147 ^ auVar176;
                lVar129 = local_2dc0._0_8_;
                lVar134 = local_2de0._0_8_;
              }
              else {
                p_Var13 = context->args->filter;
                if ((p_Var13 != (RTCFilterFunctionN)0x0) &&
                   (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                     RTC_RAY_QUERY_FLAG_INCOHERENT ||
                    ((*(byte *)((long)local_2e40 + 0x3e) & 0x40) != 0)))) {
                  auVar242 = ZEXT1664(auVar242._0_16_);
                  auVar265 = ZEXT1664(auVar265._0_16_);
                  auVar274 = ZEXT1664(auVar274._0_16_);
                  in_ZMM12 = ZEXT1664(in_ZMM12._0_16_);
                  in_ZMM13 = ZEXT1664(in_ZMM13._0_16_);
                  in_ZMM14 = ZEXT1664(in_ZMM14._0_16_);
                  in_ZMM15 = ZEXT1664(in_ZMM15._0_16_);
                  (*p_Var13)(&local_2e80);
                }
                auVar176 = vpcmpeqd_avx2(local_2c80,_DAT_01f7b000);
                auVar147 = auVar176 ^ _DAT_01f7b020;
                auVar170._8_4_ = 0xff800000;
                auVar170._0_8_ = 0xff800000ff800000;
                auVar170._12_4_ = 0xff800000;
                auVar170._16_4_ = 0xff800000;
                auVar170._20_4_ = 0xff800000;
                auVar170._24_4_ = 0xff800000;
                auVar170._28_4_ = 0xff800000;
                auVar176 = vblendvps_avx(auVar170,*(undefined1 (*) [32])(local_2e80.ray + 0x100),
                                         auVar176);
                *(undefined1 (*) [32])(local_2e80.ray + 0x100) = auVar176;
                lVar129 = local_2dc0._0_8_;
                lVar134 = local_2de0._0_8_;
              }
              RVar6 = (RTCIntersectArguments)
                      vblendvps_avx(local_2d80,(undefined1  [32])*local_2df0,auVar147);
              *local_2df0 = RVar6;
              pRVar128 = local_2df0;
            }
            auVar176 = vandnps_avx(auVar147,local_2e20);
            auVar147 = local_2e20 & ~auVar147;
            auVar186 = ZEXT3264(auVar176);
            if ((((((((auVar147 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                     (auVar147 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    (auVar147 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   SUB321(auVar147 >> 0x7f,0) == '\0') &&
                  (auVar147 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                 SUB321(auVar147 >> 0xbf,0) == '\0') &&
                (auVar147 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                -1 < auVar147[0x1f]) break;
          }
        }
      }
    }
    auVar147 = local_2ae0;
    auVar186 = ZEXT3264(local_2ae0);
    auVar162 = vandps_avx(auVar176,local_2ae0);
    unaff_R12 = (RTCIntersectArguments *)((long)&unaff_R12->flags + 1);
    auVar176 = local_2ae0 & auVar176;
    local_2ae0 = auVar162;
  } while ((((((((auVar176 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                (auVar176 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               (auVar176 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              SUB321(auVar176 >> 0x7f,0) != '\0') ||
             (auVar176 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            SUB321(auVar176 >> 0xbf,0) != '\0') ||
           (auVar176 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           auVar176[0x1f] < '\0');
  auVar147 = vpcmpeqd_avx2(auVar147,auVar147);
  auVar152._0_4_ = local_2ae0._0_4_ ^ auVar147._0_4_;
  auVar152._4_4_ = local_2ae0._4_4_ ^ auVar147._4_4_;
  auVar152._8_4_ = local_2ae0._8_4_ ^ auVar147._8_4_;
  auVar152._12_4_ = local_2ae0._12_4_ ^ auVar147._12_4_;
  auVar152._16_4_ = local_2ae0._16_4_ ^ auVar147._16_4_;
  auVar152._20_4_ = local_2ae0._20_4_ ^ auVar147._20_4_;
  auVar152._24_4_ = local_2ae0._24_4_ ^ auVar147._24_4_;
  auVar152._28_4_ = local_2ae0._28_4_ ^ auVar147._28_4_;
  local_2c20 = vorps_avx(auVar152,local_2c20);
  auVar147 = auVar147 & ~local_2c20;
  if ((((((((auVar147 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
           (auVar147 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
          (auVar147 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
         SUB321(auVar147 >> 0x7f,0) == '\0') &&
        (auVar147 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
       SUB321(auVar147 >> 0xbf,0) == '\0') &&
      (auVar147 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar147[0x1f])
  goto LAB_015ca004;
  auVar184._8_4_ = 0xff800000;
  auVar184._0_8_ = 0xff800000ff800000;
  auVar184._12_4_ = 0xff800000;
  auVar184._16_4_ = 0xff800000;
  auVar184._20_4_ = 0xff800000;
  auVar184._24_4_ = 0xff800000;
  auVar184._28_4_ = 0xff800000;
  auVar186 = ZEXT3264(auVar184);
  local_2780 = vblendvps_avx(local_2780,auVar184,local_2c20);
  goto LAB_015c8505;
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded(vint<K>* __restrict__ valid_i,
                                                                                              Accel::Intersectors* __restrict__ This,
                                                                                              RayK<K>& __restrict__ ray,
                                                                                              RayQueryContext* context)
    {
      BVH* __restrict__ bvh = (BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
#if ENABLE_FAST_COHERENT_CODEPATHS == 1
      assert(context);
      if (unlikely(types == BVH_AN1 && context->user && context->isCoherent()))
      {
        occludedCoherent(valid_i, This, ray, context);
        return;
      }
#endif

      /* filter out already occluded and invalid rays */
      vbool<K> valid = (*valid_i == -1) & (ray.tfar >= 0.0f);
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      valid &= ray.valid();
#endif

      /* return if there are no valid rays */
      const size_t valid_bits = movemask(valid);
      if (unlikely(valid_bits == 0)) return;

      /* verify correct input */
      assert(all(valid, ray.valid()));
      assert(all(valid, ray.tnear() >= 0.0f));
      assert(!(types & BVH_MB) || all(valid, (ray.time() >= 0.0f) & (ray.time() <= 1.0f)));
      Precalculations pre(valid, ray);

      /* load ray */
      TravRayK<K, robust> tray(ray.org, ray.dir, single ? N : 0);
      const vfloat<K> org_ray_tnear = max(ray.tnear(), 0.0f);
      const vfloat<K> org_ray_tfar  = max(ray.tfar , 0.0f);

      tray.tnear = select(valid, org_ray_tnear, vfloat<K>(pos_inf));
      tray.tfar  = select(valid, org_ray_tfar , vfloat<K>(neg_inf));

      vbool<K> terminated = !valid;
      const vfloat<K> inf = vfloat<K>(pos_inf);

      /* determine switch threshold based on flags */
      const size_t switchThreshold = (context->user && context->isCoherent()) ? 2 : switchThresholdIncoherent;

      /* allocate stack and push root node */
      vfloat<K> stack_near[stackSizeChunk];
      NodeRef stack_node[stackSizeChunk];
      stack_node[0] = BVH::invalidNode;
      stack_near[0] = inf;
      stack_node[1] = bvh->root;
      stack_near[1] = tray.tnear;
      NodeRef* stackEnd MAYBE_UNUSED = stack_node+stackSizeChunk;
      NodeRef* __restrict__ sptr_node = stack_node + 2;
      vfloat<K>* __restrict__ sptr_near = stack_near + 2;

      while (1) pop:
      {
        /* pop next node from stack */
        assert(sptr_node > stack_node);
        sptr_node--;
        sptr_near--;
        NodeRef cur = *sptr_node;
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }

        /* cull node if behind closest hit point */
        vfloat<K> curDist = *sptr_near;
        const vbool<K> active = curDist < tray.tfar;
        if (unlikely(none(active)))
          continue;

        /* switch to single ray traversal */
#if (!defined(__WIN32__) || defined(__X86_64__)) && ((defined(__aarch64__)) || defined(__SSE4_2__))
#if FORCE_SINGLE_MODE == 0
        if (single)
#endif
        {
          size_t bits = movemask(active);
#if FORCE_SINGLE_MODE == 0
          if (unlikely(popcnt(bits) <= switchThreshold)) 
#endif
          {
            for (; bits!=0; ) {
              const size_t i = bscf(bits);
              if (occluded1(This, bvh, cur, i, pre, ray, tray, context))
                set(terminated, i);
            }
            if (all(terminated)) break;
            tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar);
            continue;
          }
        }
#endif

        while (likely(!cur.isLeaf()))
        {
          /* process nodes */
          const vbool<K> valid_node = tray.tfar > curDist;
          STAT3(shadow.trav_nodes, 1, popcnt(valid_node), K);
          const NodeRef nodeRef = cur;
          const BaseNode* __restrict__ const node = nodeRef.baseNode();

          /* set cur to invalid */
          cur = BVH::emptyNode;
          curDist = pos_inf;

          for (unsigned i = 0; i < N; i++)
          {
            const NodeRef child = node->children[i];
            if (unlikely(child == BVH::emptyNode)) break;
            vfloat<K> lnearP;
            vbool<K> lhit = valid_node;
            BVHNNodeIntersectorK<N, K, types, robust>::intersect(nodeRef, i, tray, ray.time(), lnearP, lhit);

            /* if we hit the child we push the previously hit node onto the stack, and continue with the currently hit child */
            if (likely(any(lhit)))
            {
              assert(sptr_node < stackEnd);
              assert(child != BVH::emptyNode);
              const vfloat<K> childDist = select(lhit, lnearP, inf);

              /* push 'cur' node onto stack and continue with hit child */
              if (likely(cur != BVH::emptyNode)) {
                *sptr_node = cur; sptr_node++;
                *sptr_near = curDist; sptr_near++;
              }
              curDist = childDist;
              cur = child;
            }
          }
          if (unlikely(cur == BVH::emptyNode))
            goto pop;

#if SWITCH_DURING_DOWN_TRAVERSAL == 1
          if (single)
          {
            // seems to be the best place for testing utilization
            if (unlikely(popcnt(tray.tfar > curDist) <= switchThreshold))
            {
              *sptr_node++ = cur;
              *sptr_near++ = curDist;
              goto pop;
            }
          }
#endif
	}

        /* return if stack is empty */
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }


        /* intersect leaf */
        assert(cur != BVH::emptyNode);
        const vbool<K> valid_leaf = tray.tfar > curDist;
        STAT3(shadow.trav_leaves, 1, popcnt(valid_leaf), K);
        if (unlikely(none(valid_leaf))) continue;
        size_t items; const Primitive* prim = (Primitive*) cur.leaf(items);

        size_t lazy_node = 0;
        terminated |= PrimitiveIntersectorK::occluded(!terminated, This, pre, ray, context, prim, items, tray, lazy_node);
        if (all(terminated)) break;
        tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar); // ignore node intersections for terminated rays

        if (unlikely(lazy_node)) {
          *sptr_node = lazy_node; sptr_node++;
          *sptr_near = neg_inf;   sptr_near++;
        }
      }

      vfloat<K>::store(valid & terminated, &ray.tfar, neg_inf);
    }